

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalJacobianContIntDamping
          (ChElementShellANCF_3833 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  Matrix<double,__1,__1,_0,__1,__1> *xpr;
  Matrix<double,__1,__1,_1,__1,__1> *xpr_00;
  long lVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  ChVariables **ppCVar4;
  element_type *peVar5;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar6;
  XprTypeNested pMVar7;
  XprTypeNested pMVar8;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *this_00;
  ChElementShellANCF_3833 *pCVar9;
  undefined8 *puVar10;
  XprTypeNested pMVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  PointerType pdVar14;
  double dVar15;
  variable_if_dynamic<long,__1> vVar16;
  variable_if_dynamic<long,__1> vVar17;
  double dVar18;
  undefined1 auVar19 [32];
  long lVar20;
  Scalar *pSVar21;
  long startCol;
  long lVar22;
  long lVar23;
  ChElementShellANCF_3833 *this_01;
  long lVar24;
  int i;
  long lVar25;
  Scalar SVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Matrix<double,__1,__1,_1,__1,__1> PE;
  Matrix<double,__1,__1,_1,__1,__1> DScaled_Combined_PE;
  Matrix<double,__1,__1,_1,__1,__1> Scaled_Combined_PE;
  ChMatrixNM<double,_6,_6> D;
  VectorNIP E6_Block;
  VectorNIP E_BlockDamping;
  VectorNIP E1_Block;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP E2_Block;
  VectorNIP SPK2_1_Block;
  VectorNIP E5_Block;
  VectorNIP E4_Block;
  VectorNIP E3_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict2 S_scaled_SD;
  ChMatrixNMc<double,_3_*_NIP,_3> FCscaled;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  MatrixNx6 ebar_ebardot;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_4cf0;
  double *local_4cd0;
  ChVariables **local_4cc8;
  element_type *local_4cc0;
  Matrix<double,__1,__1,_1,__1,__1> *local_4cb8;
  Matrix<double,__1,__1,_1,__1,__1> *local_4cb0;
  XprTypeNested local_4ca8;
  XprTypeNested local_4ca0;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_4c98;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> local_4c90;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_4c60;
  long local_4c48;
  undefined8 *local_4c40;
  ChVariables **local_4c38;
  Matrix<double,__1,__1,_1,__1,__1> *local_4c30;
  Matrix<double,__1,__1,_1,__1,__1> *local_4c28;
  ChVariables **local_4c20;
  Matrix<double,__1,__1,_1,__1,__1> *local_4c18;
  Matrix<double,__1,__1,_1,__1,__1> *local_4c10;
  double local_4c08;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_4c00;
  ChMatrixNM<double,_6,_6> local_4be0;
  undefined1 local_4ac0 [16];
  LhsNested LStack_4ab0;
  variable_if_dynamic<long,__1> vStack_4aa8;
  variable_if_dynamic<long,__1> vStack_4aa0;
  element_type *peStack_4a98;
  scalar_constant_op<double> sStack_4a90;
  variable_if_dynamic<long,__1> vStack_4a88;
  element_type *peStack_4a80;
  LhsNested local_4a70;
  scalar_constant_op<double> sStack_4a68;
  element_type *peStack_4a60;
  XprTypeNested pMStack_4a58;
  variable_if_dynamic<long,__1> vStack_4a50;
  variable_if_dynamic<long,__1> vStack_4a48;
  scalar_constant_op<double> sStack_4a40;
  LhsNested local_4a28;
  undefined8 auStack_4a20 [38];
  undefined1 local_48f0 [16];
  scalar_constant_op<double> sStack_48e0;
  variable_if_dynamic<long,__1> vStack_48d8;
  variable_if_dynamic<long,__1> vStack_48d0;
  element_type *peStack_48c8;
  double local_48b0;
  RhsNested local_48a8;
  double *local_4890;
  double *local_4888;
  double *local_4880;
  double *local_4878;
  ChElementShellANCF_3833 *local_4870;
  long local_4868;
  undefined1 local_4860 [16];
  scalar_constant_op<double> sStack_4850;
  variable_if_dynamic<long,__1> vStack_4848;
  variable_if_dynamic<long,__1> vStack_4840;
  scalar_constant_op<double> sStack_4838;
  variable_if_dynamic<long,__1> vStack_4830;
  variable_if_dynamic<long,__1> vStack_4828;
  element_type *peStack_4820;
  undefined8 *local_46f0;
  double local_46e8;
  Matrix<double,__1,__1,_1,__1,__1> *local_46e0;
  XprTypeNested local_46d8;
  undefined1 local_46d0 [16];
  element_type *peStack_46c0;
  variable_if_dynamic<long,__1> vStack_46b8;
  scalar_constant_op<double> sStack_46b0;
  element_type *peStack_46a8;
  double dStack_46a0;
  XprTypeNested pMStack_4698;
  long lStack_4690;
  scalar_constant_op<double> sStack_4688;
  RhsNested pMStack_4680;
  double local_4660;
  scalar_constant_op<double> sStack_4658;
  RhsNested pMStack_4650;
  XprTypeNested local_4648;
  double dStack_4640;
  double dStack_4638;
  double dStack_4630;
  double local_4608;
  undefined8 local_4600 [8];
  undefined1 local_45c0 [16];
  XprTypeNested pMStack_45b0;
  long lStack_45a8;
  double dStack_45a0;
  RhsNested pMStack_4598;
  Block<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_18,_false> local_4520;
  undefined1 local_44f0 [24];
  element_type *local_44d8;
  double dStack_44d0;
  XprTypeNested pMStack_44c8;
  variable_if_dynamic<long,__1> vStack_44c0;
  variable_if_dynamic<long,__1> vStack_44b8;
  RhsNested pMStack_44b0;
  undefined1 local_4460 [24];
  PointerType local_4448;
  RhsNested pMStack_4440;
  XprTypeNested pMStack_4438;
  variable_if_dynamic<long,__1> vStack_4430;
  variable_if_dynamic<long,__1> vStack_4428;
  double dStack_4420;
  Matrix<double,_18,_1,_0,_18,_1> local_43d0;
  undefined1 local_4340 [144];
  undefined1 local_42b0 [24];
  PointerType local_4298;
  double dStack_4290;
  XprTypeNested pMStack_4288;
  variable_if_dynamic<long,__1> vStack_4280;
  variable_if_dynamic<long,__1> vStack_4278;
  double dStack_4270;
  Matrix<double,_18,_1,_0,_18,_1> local_4220;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
  local_4180;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
  local_40f0;
  undefined1 local_4060 [144];
  undefined1 local_3fd0 [24];
  RhsNested local_3fb8;
  double local_3fb0;
  double local_3f90;
  element_type *local_3f88;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_3f38;
  Matrix<double,_18,_1,_0,_18,_1> local_3f10;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_3e78;
  Matrix<double,_18,_1,_0,_18,_1> local_3e50;
  undefined1 local_3dc0 [16];
  scalar_constant_op<double> sStack_3db0;
  variable_if_dynamic<long,__1> vStack_3da8;
  undefined1 auStack_3da0 [16];
  element_type *peStack_3d90;
  scalar_constant_op<double> sStack_3d88;
  XprTypeNested pMStack_3d80;
  variable_if_dynamic<long,__1> vStack_3d78;
  variable_if_dynamic<long,__1> vStack_3d70;
  variable_if_dynamic<long,__1> local_3d68;
  scalar_constant_op<double> sStack_3d60;
  XprTypeNested local_3d58;
  element_type *local_3d50;
  element_type *local_3d48;
  element_type *local_3d40;
  scalar_constant_op<double> sStack_3d38;
  scalar_constant_op<double> sStack_3d30;
  element_type *peStack_3d28;
  XprTypeNested local_3d20;
  variable_if_dynamic<long,__1> local_3d18;
  variable_if_dynamic<long,__1> local_3d10;
  variable_if_dynamic<long,__1> local_3d08;
  scalar_constant_op<double> local_3d00;
  RhsNested local_3cf8;
  XprTypeNested local_3cf0;
  double local_3ce8;
  scalar_constant_op<double> local_3ce0;
  Matrix<double,__1,__1,_1,__1,__1> *local_3cd8;
  XprTypeNested local_3cc8;
  variable_if_dynamic<long,__1> local_3cc0;
  variable_if_dynamic<long,__1> local_3cb8;
  XprTypeNested local_3cb0;
  Matrix<double,__1,__1,_1,__1,__1> *local_3ca8;
  scalar_constant_op<double> local_3ca0;
  XprTypeNested local_3c98;
  undefined1 *local_3c90;
  scalar_constant_op<double> local_3c88;
  XprTypeNested local_3c80;
  double local_3c78;
  XprTypeNested local_3c70;
  variable_if_dynamic<long,__1> local_3c68;
  XprTypeNested local_3c50;
  XprTypeNested local_3c40;
  double local_3c38;
  scalar_constant_op<double> sStack_3c30;
  PointerType local_3c28;
  undefined1 *local_3c20;
  variable_if_dynamic<long,__1> local_3c10;
  variable_if_dynamic<long,__1> local_3c08;
  double local_3c00;
  double local_3bf8;
  element_type *local_3be0;
  XprTypeNested local_3bd0;
  double local_3bc8;
  XprTypeNested local_3bc0;
  variable_if_dynamic<long,__1> local_3bb8;
  variable_if_dynamic<long,__1> local_3bb0;
  XprTypeNested local_3ba0;
  double local_3b98;
  double local_3b90;
  double local_3b88;
  Matrix<double,__1,__1,_1,__1,__1> *local_3b70;
  XprTypeNested local_3b60;
  double local_3b58;
  double local_3b50;
  double local_3b48;
  undefined1 *local_3b40;
  XprTypeNested local_3b30;
  double local_3b28;
  double local_3b20;
  double local_3b18;
  XprTypeNested pMStack_1540;
  XprTypeNested pMStack_1538;
  element_type *local_1530;
  XprTypeNested pMStack_1528;
  XprTypeNested pMStack_1520;
  element_type *peStack_1518;
  XprTypeNested pMStack_1500;
  XprTypeNested pMStack_14f8;
  element_type *local_14f0;
  XprTypeNested pMStack_14e8;
  XprTypeNested pMStack_14e0;
  element_type *peStack_14d8;
  XprTypeNested pMStack_14c0;
  XprTypeNested pMStack_14b8;
  element_type *local_14b0;
  XprTypeNested pMStack_14a8;
  XprTypeNested pMStack_14a0;
  element_type *peStack_1498;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_1488;
  undefined1 local_1460 [288];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1340 [6];
  ChVariables *apCStack_12b0 [18];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1220 [6];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1190 [6];
  ChVariables *apCStack_1100 [18];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_1070 [6];
  Matrix<double,__1,__1,_1,__1,__1> aMStack_fe0 [6];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
  local_f48;
  undefined1 local_f20 [288];
  undefined1 local_e00 [288];
  Matrix<double,__1,__1,_1,__1,__1> local_ce0 [6];
  Matrix<double,__1,__1,_1,__1,__1> local_c50 [6];
  ChVariables *local_bc0 [18];
  Matrix<double,__1,__1,_1,__1,__1> local_b30 [6];
  Matrix<double,__1,__1,_1,__1,__1> local_aa0 [6];
  undefined1 local_a10 [288];
  undefined1 local_8f0 [2240];
  
  local_4c08 = Kfactor;
  local_46e8 = Rfactor;
  CalcCombinedCoordMatrix(this,(MatrixNx6 *)(local_8f0 + 0x3f0));
  Eigen::
  DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
  setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           *)H);
  local_4ca8 = (XprTypeNested)local_e00;
  local_46e0 = aMStack_1340;
  local_4cc0 = (element_type *)(local_e00 + 0x90);
  local_4c20 = apCStack_12b0;
  local_4c18 = aMStack_1220;
  local_4cb0 = local_c50;
  local_4c10 = aMStack_1190;
  local_4cc8 = local_bc0;
  local_4c38 = apCStack_1100;
  local_4c30 = aMStack_1070;
  local_4cb8 = local_aa0;
  local_4c28 = aMStack_fe0;
  local_4ca0 = (XprTypeNested)(local_f20 + 0x90);
  local_46d8 = (XprTypeNested)(local_1460 + 0x90);
  local_4878 = local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x12;
  local_4cd0 = &this->m_Alpha;
  local_46f0 = local_4600;
  local_4888 = local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x1a;
  local_4880 = local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
               m_data.array + 0x14;
  local_4c40 = auStack_4a20;
  xpr = &this->m_kGQ;
  xpr_00 = &this->m_SD;
  lVar23 = 0;
  local_4890 = &local_3c38;
  local_4c98 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                *)H;
  local_4870 = this;
  while( true ) {
    if (local_4870->m_numLayers <= lVar23) break;
    startCol = lVar23 * 0x36;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_24,_54,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false> *)local_1460,xpr_00,0
               ,startCol);
    auVar19 = _auStack_3da0;
    auStack_3da0._8_8_ = local_1460._40_8_;
    auStack_3da0._0_8_ = local_1460._32_8_;
    local_3dc0._8_8_ = local_1460._8_8_;
    local_3dc0._0_8_ = local_1460._0_8_;
    sStack_3db0.m_other = (double)local_1460._16_8_;
    vStack_3da8.m_value = local_1460._24_8_;
    sStack_3d88.m_other = auVar19._24_8_;
    peStack_3d90 = (element_type *)(local_8f0 + 0x3f0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,24,54,false>>,Eigen::Matrix<double,24,6,1,24,6>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,54,6,0,54,6>> *)local_f20,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false>_>,_Eigen::Matrix<double,_24,_6,_1,_24,_6>,_0>_>
                *)local_3dc0);
    local_4cf0.m_storage.m_cols = 0;
    local_4cf0.m_storage.m_data = (double *)0x0;
    local_4cf0.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_4cf0,0x48,0x6c)
    ;
    lVar24 = 0;
    lVar25 = 0;
    lVar22 = lVar23 * 0x3600000000 + 0x2400000000 >> 0x20;
    lVar20 = lVar23 * 0x3600000000 + 0x1200000000 >> 0x20;
    local_4c48 = lVar23;
    while( true ) {
      pdVar3 = local_4cd0;
      if (lVar25 == 0x18) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_1460,xpr_00,
                 lVar25,startCol);
      auVar19 = _auStack_3da0;
      auStack_3da0._8_8_ = local_1460._40_8_;
      auStack_3da0._0_8_ = local_1460._32_8_;
      local_3dc0._0_8_ = local_1460._0_8_;
      local_3dc0._8_8_ = local_1460._8_8_;
      sStack_3db0.m_other = (double)local_1460._16_8_;
      vStack_3da8.m_value = local_1460._24_8_;
      sStack_3d88.m_other = auVar19._24_8_;
      peStack_3d90 = (element_type *)local_f20;
      vStack_3d78.m_value = 0;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0x36;
      pMStack_3d80 = (XprTypeNested)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar24,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_1460,xpr_00,
                 lVar25,lVar20);
      pMVar8 = local_4ca0;
      auStack_3da0._8_8_ = local_1460._40_8_;
      auStack_3da0._0_8_ = local_1460._32_8_;
      local_3dc0._0_8_ = local_1460._0_8_;
      local_3dc0._8_8_ = local_1460._8_8_;
      sStack_3db0.m_other = (double)local_1460._16_8_;
      vStack_3da8.m_value = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_4ca0;
      vStack_3d78.m_value = 0x12;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0x36;
      pMStack_3d80 = (XprTypeNested)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar24,0x12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_1460,xpr_00,
                 lVar25,lVar22);
      pMVar7 = local_4ca8;
      auStack_3da0._8_8_ = local_1460._40_8_;
      auStack_3da0._0_8_ = local_1460._32_8_;
      local_3dc0._8_8_ = local_1460._8_8_;
      local_3dc0._0_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._16_8_;
      vStack_3da8.m_value = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_4ca8;
      vStack_3d78.m_value = 0x24;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0x36;
      pMStack_3d80 = (XprTypeNested)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar24,0x24);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar22);
      local_1460._32_8_ = vStack_4aa0.m_value;
      local_1460._40_8_ = peStack_4a98;
      local_1460._0_8_ = local_4ac0._0_8_;
      local_1460._8_8_ = local_4ac0._8_8_;
      local_1460._16_8_ = LStack_4ab0.m_matrix;
      local_1460._24_8_ = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar20);
      sStack_3d30.m_other = (double)vStack_4840.m_value;
      peStack_3d28 = (element_type *)sStack_4838.m_other;
      local_3d50 = (element_type *)local_4860._0_8_;
      local_3d48 = (element_type *)local_4860._8_8_;
      local_3d40 = (element_type *)sStack_4850.m_other;
      sStack_3d38.m_other = (double)vStack_4848.m_value;
      auStack_3da0._8_8_ = local_1460._32_8_;
      auStack_3da0._0_8_ = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_1460._40_8_;
      local_3dc0._8_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._8_8_;
      vStack_3da8.m_value = local_1460._16_8_;
      vStack_3d78.m_value = (long)local_f20;
      sStack_3d88.m_other = (double)pMVar8;
      vStack_3d70.m_value = 0x12;
      local_3d68.m_value = 0;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = pMVar7;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 0.0;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar24,0x36);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar22);
      local_1460._32_8_ = vStack_4aa0.m_value;
      local_1460._40_8_ = peStack_4a98;
      local_1460._0_8_ = local_4ac0._0_8_;
      local_1460._8_8_ = local_4ac0._8_8_;
      local_1460._16_8_ = LStack_4ab0.m_matrix;
      local_1460._24_8_ = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,startCol);
      sStack_3d30.m_other = (double)vStack_4840.m_value;
      peStack_3d28 = (element_type *)sStack_4838.m_other;
      local_3d50 = (element_type *)local_4860._0_8_;
      local_3d48 = (element_type *)local_4860._8_8_;
      local_3d40 = (element_type *)sStack_4850.m_other;
      sStack_3d38.m_other = (double)vStack_4848.m_value;
      auStack_3da0._8_8_ = local_1460._32_8_;
      auStack_3da0._0_8_ = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_1460._40_8_;
      local_3dc0._8_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._8_8_;
      vStack_3da8.m_value = local_1460._16_8_;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = pMVar7;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 0.0;
      local_3cf8 = (RhsNested)0x36;
      vStack_3d78.m_value = (long)local_f20;
      local_3d10.m_value = (long)local_f20;
      sStack_3d88.m_other = (double)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar24,0x48);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar20);
      local_1460._32_8_ = vStack_4aa0.m_value;
      local_1460._40_8_ = peStack_4a98;
      local_1460._0_8_ = local_4ac0._0_8_;
      local_1460._8_8_ = local_4ac0._8_8_;
      local_1460._16_8_ = LStack_4ab0.m_matrix;
      local_1460._24_8_ = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,startCol);
      sStack_3d30.m_other = (double)vStack_4840.m_value;
      peStack_3d28 = (element_type *)sStack_4838.m_other;
      local_3d50 = (element_type *)local_4860._0_8_;
      local_3d48 = (element_type *)local_4860._8_8_;
      local_3d40 = (element_type *)sStack_4850.m_other;
      sStack_3d38.m_other = (double)vStack_4848.m_value;
      auStack_3da0._8_8_ = local_1460._32_8_;
      auStack_3da0._0_8_ = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_1460._40_8_;
      local_3dc0._8_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._8_8_;
      vStack_3da8.m_value = local_1460._16_8_;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = pMVar8;
      local_3d08.m_value = 0x12;
      local_3d00.m_other = 0.0;
      local_3cf8 = (RhsNested)0x36;
      vStack_3d78.m_value = (long)local_f20;
      local_3d10.m_value = (long)local_f20;
      sStack_3d88.m_other = (double)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar24,0x5a);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_1460,xpr_00,
                 lVar25,startCol);
      lVar23 = lVar24 + 1;
      auStack_3da0._8_8_ = local_1460._40_8_;
      auStack_3da0._0_8_ = local_1460._32_8_;
      local_3dc0._0_8_ = local_1460._0_8_;
      local_3dc0._8_8_ = local_1460._8_8_;
      sStack_3db0.m_other = (double)local_1460._16_8_;
      vStack_3da8.m_value = local_1460._24_8_;
      peStack_3d90 = local_4cc0;
      vStack_3d78.m_value = 0;
      vStack_3d70.m_value = 1;
      local_3d68.m_value = 0x36;
      pMStack_3d80 = (XprTypeNested)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_1460,xpr_00,
                 lVar25,lVar20);
      auStack_3da0._8_8_ = local_1460._40_8_;
      auStack_3da0._0_8_ = local_1460._32_8_;
      local_3dc0._0_8_ = local_1460._0_8_;
      local_3dc0._8_8_ = local_1460._8_8_;
      sStack_3db0.m_other = (double)local_1460._16_8_;
      vStack_3da8.m_value = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_ce0;
      vStack_3d78.m_value = 0x12;
      vStack_3d70.m_value = 1;
      local_3d68.m_value = 0x36;
      pMStack_3d80 = (XprTypeNested)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_1460,xpr_00,
                 lVar25,lVar22);
      pMVar6 = local_4cb0;
      auStack_3da0._8_8_ = local_1460._40_8_;
      auStack_3da0._0_8_ = local_1460._32_8_;
      local_3dc0._8_8_ = local_1460._8_8_;
      local_3dc0._0_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._16_8_;
      vStack_3da8.m_value = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_4cb0;
      vStack_3d78.m_value = 0x24;
      vStack_3d70.m_value = 1;
      local_3d68.m_value = 0x36;
      pMStack_3d80 = (XprTypeNested)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x24);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar22);
      local_1460._32_8_ = vStack_4aa0.m_value;
      local_1460._40_8_ = peStack_4a98;
      local_1460._0_8_ = local_4ac0._0_8_;
      local_1460._8_8_ = local_4ac0._8_8_;
      local_1460._16_8_ = LStack_4ab0.m_matrix;
      local_1460._24_8_ = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar20);
      vStack_3d78.m_value = (long)local_f20;
      sStack_3d30.m_other = (double)vStack_4840.m_value;
      peStack_3d28 = (element_type *)sStack_4838.m_other;
      local_3d50 = (element_type *)local_4860._0_8_;
      local_3d48 = (element_type *)local_4860._8_8_;
      local_3d40 = (element_type *)sStack_4850.m_other;
      sStack_3d38.m_other = (double)vStack_4848.m_value;
      auStack_3da0._8_8_ = local_1460._32_8_;
      auStack_3da0._0_8_ = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_1460._40_8_;
      local_3dc0._8_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._8_8_;
      vStack_3da8.m_value = local_1460._16_8_;
      vStack_3d70.m_value = 0x12;
      local_3d68.m_value = 1;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)pMVar6;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 4.94065645841247e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      sStack_3d88.m_other = (double)local_ce0;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x36);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar22);
      local_1460._32_8_ = vStack_4aa0.m_value;
      local_1460._40_8_ = peStack_4a98;
      local_1460._0_8_ = local_4ac0._0_8_;
      local_1460._8_8_ = local_4ac0._8_8_;
      local_1460._16_8_ = LStack_4ab0.m_matrix;
      local_1460._24_8_ = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,startCol);
      sStack_3d30.m_other = (double)vStack_4840.m_value;
      peStack_3d28 = (element_type *)sStack_4838.m_other;
      local_3d50 = (element_type *)local_4860._0_8_;
      local_3d48 = (element_type *)local_4860._8_8_;
      local_3d40 = (element_type *)sStack_4850.m_other;
      sStack_3d38.m_other = (double)vStack_4848.m_value;
      auStack_3da0._8_8_ = local_1460._32_8_;
      auStack_3da0._0_8_ = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_1460._40_8_;
      local_3dc0._8_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._8_8_;
      vStack_3da8.m_value = local_1460._16_8_;
      sStack_3d88.m_other = (double)local_4cc0;
      vStack_3d78.m_value = (long)local_f20;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 1;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)pMVar6;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 4.94065645841247e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x48);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar20);
      local_1460._32_8_ = vStack_4aa0.m_value;
      local_1460._40_8_ = peStack_4a98;
      local_1460._0_8_ = local_4ac0._0_8_;
      local_1460._8_8_ = local_4ac0._8_8_;
      local_1460._16_8_ = LStack_4ab0.m_matrix;
      local_1460._24_8_ = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,startCol);
      vStack_3d78.m_value = (long)local_f20;
      sStack_3d30.m_other = (double)vStack_4840.m_value;
      peStack_3d28 = (element_type *)sStack_4838.m_other;
      local_3d50 = (element_type *)local_4860._0_8_;
      local_3d48 = (element_type *)local_4860._8_8_;
      local_3d40 = (element_type *)sStack_4850.m_other;
      sStack_3d38.m_other = (double)vStack_4848.m_value;
      auStack_3da0._8_8_ = local_1460._32_8_;
      auStack_3da0._0_8_ = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_1460._40_8_;
      local_3dc0._8_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._8_8_;
      vStack_3da8.m_value = local_1460._16_8_;
      sStack_3d88.m_other = (double)local_4cc0;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 1;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d08.m_value = 0x12;
      local_3d00.m_other = 4.94065645841247e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d20 = (XprTypeNested)local_ce0;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x5a);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_1460,xpr_00,
                 lVar25,startCol);
      lVar23 = lVar24 + 2;
      auStack_3da0._8_8_ = local_1460._40_8_;
      auStack_3da0._0_8_ = local_1460._32_8_;
      local_3dc0._0_8_ = local_1460._0_8_;
      local_3dc0._8_8_ = local_1460._8_8_;
      sStack_3db0.m_other = (double)local_1460._16_8_;
      vStack_3da8.m_value = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_4cc8;
      vStack_3d78.m_value = 0;
      vStack_3d70.m_value = 2;
      local_3d68.m_value = 0x36;
      pMStack_3d80 = (XprTypeNested)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_1460,xpr_00,
                 lVar25,lVar20);
      auStack_3da0._8_8_ = local_1460._40_8_;
      auStack_3da0._0_8_ = local_1460._32_8_;
      local_3dc0._0_8_ = local_1460._0_8_;
      local_3dc0._8_8_ = local_1460._8_8_;
      sStack_3db0.m_other = (double)local_1460._16_8_;
      vStack_3da8.m_value = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_b30;
      vStack_3d78.m_value = 0x12;
      vStack_3d70.m_value = 2;
      local_3d68.m_value = 0x36;
      pMStack_3d80 = (XprTypeNested)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_1460,xpr_00,
                 lVar25,lVar22);
      pMVar6 = local_4cb8;
      auStack_3da0._8_8_ = local_1460._40_8_;
      auStack_3da0._0_8_ = local_1460._32_8_;
      local_3dc0._8_8_ = local_1460._8_8_;
      local_3dc0._0_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._16_8_;
      vStack_3da8.m_value = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_4cb8;
      vStack_3d78.m_value = 0x24;
      vStack_3d70.m_value = 2;
      local_3d68.m_value = 0x36;
      pMStack_3d80 = (XprTypeNested)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x24);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar22);
      local_1460._32_8_ = vStack_4aa0.m_value;
      local_1460._40_8_ = peStack_4a98;
      local_1460._0_8_ = local_4ac0._0_8_;
      local_1460._8_8_ = local_4ac0._8_8_;
      local_1460._16_8_ = LStack_4ab0.m_matrix;
      local_1460._24_8_ = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar20);
      vStack_3d78.m_value = (long)local_f20;
      sStack_3d30.m_other = (double)vStack_4840.m_value;
      peStack_3d28 = (element_type *)sStack_4838.m_other;
      local_3d50 = (element_type *)local_4860._0_8_;
      local_3d48 = (element_type *)local_4860._8_8_;
      local_3d40 = (element_type *)sStack_4850.m_other;
      sStack_3d38.m_other = (double)vStack_4848.m_value;
      auStack_3da0._8_8_ = local_1460._32_8_;
      auStack_3da0._0_8_ = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_1460._40_8_;
      local_3dc0._8_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._8_8_;
      vStack_3da8.m_value = local_1460._16_8_;
      vStack_3d70.m_value = 0x12;
      local_3d68.m_value = 2;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)pMVar6;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 9.88131291682493e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      sStack_3d88.m_other = (double)local_b30;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x36);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar22);
      local_1460._32_8_ = vStack_4aa0.m_value;
      local_1460._40_8_ = peStack_4a98;
      local_1460._0_8_ = local_4ac0._0_8_;
      local_1460._8_8_ = local_4ac0._8_8_;
      local_1460._16_8_ = LStack_4ab0.m_matrix;
      local_1460._24_8_ = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,startCol);
      sStack_3d30.m_other = (double)vStack_4840.m_value;
      peStack_3d28 = (element_type *)sStack_4838.m_other;
      local_3d50 = (element_type *)local_4860._0_8_;
      local_3d48 = (element_type *)local_4860._8_8_;
      local_3d40 = (element_type *)sStack_4850.m_other;
      sStack_3d38.m_other = (double)vStack_4848.m_value;
      auStack_3da0._8_8_ = local_1460._32_8_;
      auStack_3da0._0_8_ = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_1460._40_8_;
      local_3dc0._8_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._8_8_;
      vStack_3da8.m_value = local_1460._16_8_;
      sStack_3d88.m_other = (double)local_4cc8;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 2;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)pMVar6;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 9.88131291682493e-324;
      local_3cf8 = (RhsNested)0x36;
      vStack_3d78.m_value = (long)local_f20;
      local_3d10.m_value = (long)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x48);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar20);
      local_1460._32_8_ = vStack_4aa0.m_value;
      local_1460._40_8_ = peStack_4a98;
      local_1460._0_8_ = local_4ac0._0_8_;
      local_1460._8_8_ = local_4ac0._8_8_;
      local_1460._16_8_ = LStack_4ab0.m_matrix;
      local_1460._24_8_ = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,startCol);
      sStack_3d30.m_other = (double)vStack_4840.m_value;
      peStack_3d28 = (element_type *)sStack_4838.m_other;
      local_3d50 = (element_type *)local_4860._0_8_;
      local_3d48 = (element_type *)local_4860._8_8_;
      local_3d40 = (element_type *)sStack_4850.m_other;
      sStack_3d38.m_other = (double)vStack_4848.m_value;
      auStack_3da0._8_8_ = local_1460._32_8_;
      auStack_3da0._0_8_ = local_1460._24_8_;
      peStack_3d90 = (element_type *)local_1460._40_8_;
      local_3dc0._8_8_ = local_1460._0_8_;
      sStack_3db0.m_other = (double)local_1460._8_8_;
      vStack_3da8.m_value = local_1460._16_8_;
      sStack_3d88.m_other = (double)local_4cc8;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 2;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d08.m_value = 0x12;
      local_3d00.m_other = 9.88131291682493e-324;
      local_3cf8 = (RhsNested)0x36;
      vStack_3d78.m_value = (long)local_f20;
      local_3d20 = (XprTypeNested)local_b30;
      local_3d10.m_value = (long)local_f20;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4cf0,lVar23,0x5a);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      lVar25 = lVar25 + 1;
      lVar24 = lVar24 + 3;
      H = (ChMatrixRef *)local_4c98;
    }
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_46e8;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *local_4cd0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_4c08;
    auVar2 = vfmadd213sd_fma(auVar27,auVar28,auVar2);
    local_44f0._0_8_ = auVar2._0_8_;
    local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [3] = 0.0;
    local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [4] = 0.0;
    local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [5] = 2.66795448754273e-322;
    local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [0] = (double)local_f20;
    local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array
    [2] = (double)local_f20;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_54,_3,_0,_54,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_54,_3,_false>_>
                      *)local_4ac0,(double *)local_44f0,(StorageBaseType *)&local_4be0);
    local_46d0._0_8_ = local_a10;
    local_4460._0_8_ = *pdVar3 * local_4c08;
    vStack_46b8.m_value = 0;
    sStack_46b0.m_other = 1.48219693752374e-323;
    peStack_46a8 = (element_type *)0x36;
    peStack_46c0 = (element_type *)local_f20;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_54,_3,_0,_54,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_54,_3,_false>_>
                      *)local_4860,(double *)local_4460,(StorageBaseType *)local_46d0);
    auStack_3da0._8_8_ = vStack_4aa0.m_value;
    auStack_3da0._0_8_ = vStack_4aa8.m_value;
    peStack_3d90 = peStack_4a98;
    sStack_3d88.m_other = sStack_4a90.m_other;
    vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
    pMStack_3d80 = (XprTypeNested)vStack_4a88.m_value;
    vStack_3d78.m_value = (long)peStack_4a80;
    local_3d58 = (XprTypeNested)sStack_4850.m_other;
    sStack_3d30.m_other = (double)vStack_4828.m_value;
    peStack_3d28 = peStack_4820;
    local_3d50 = (element_type *)vStack_4848.m_value;
    local_3d48 = (element_type *)vStack_4840.m_value;
    local_3d40 = (element_type *)sStack_4838.m_other;
    sStack_3d38.m_other = (double)vStack_4830.m_value;
    Eigen::PlainObjectBase<Eigen::Matrix<double,54,3,0,54,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,54,3,0,54,3>const>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,54,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,54,3,0,54,3>const>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,54,3,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,54,3,0,54,3>> *)local_1460,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_54,_3,_0,_54,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_54,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_54,_3,_0,_54,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_54,_3,_false>_>_>_>
                *)local_3dc0);
    lVar24 = local_4c48 * 0x12;
    lVar23 = 0;
    while( true ) {
      if (lVar23 == 3) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)local_4ac0,xpr,
                 lVar24,0);
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)&local_4be0,
                 (Matrix<double,_54,_3,_0,_54,_3> *)local_1460,0,lVar23);
      vStack_4840.m_value =
           (long)local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[4];
      sStack_4838.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[5];
      local_4860._0_8_ =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0];
      local_4860._8_8_ =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[1];
      sStack_4850.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[2];
      vStack_4848.m_value =
           (long)local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[3];
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>>::
      operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>>
                  *)local_4860,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)local_4ac0,xpr,
                 lVar24,0);
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)&local_4be0,
                 (Matrix<double,_54,_3,_0,_54,_3> *)local_1460,0x12,lVar23);
      vStack_4840.m_value =
           (long)local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[4];
      sStack_4838.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[5];
      local_4860._0_8_ =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0];
      local_4860._8_8_ =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[1];
      sStack_4850.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[2];
      vStack_4848.m_value =
           (long)local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[3];
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>>::
      operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>>
                  *)local_4860,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)local_4ac0,xpr,
                 lVar24,0);
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false> *)&local_4be0,
                 (Matrix<double,_54,_3,_0,_54,_3> *)local_1460,0x24,lVar23);
      vStack_4840.m_value =
           (long)local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[4];
      sStack_4838.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[5];
      local_4860._0_8_ =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[0];
      local_4860._8_8_ =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[1];
      sStack_4850.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[2];
      vStack_4848.m_value =
           (long)local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                 m_data.array[3];
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>>::
      operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>>
                  *)local_4860,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                  *)local_3dc0);
      lVar23 = lVar23 + 1;
    }
    local_4c00.m_storage.m_cols = 0;
    local_4c00.m_storage.m_data = (double *)0x0;
    local_4c00.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_4c00,0x48,0x6c)
    ;
    lVar23 = 0;
    lVar25 = 0;
    while( true ) {
      pCVar9 = local_4870;
      lVar1 = local_4c48;
      if (lVar25 == 0x18) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,startCol);
      auVar19 = _auStack_3da0;
      pMStack_3d80 = (XprTypeNested)local_1460;
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      sStack_3d88.m_other = auVar19._24_8_;
      peStack_3d90 = (element_type *)pMStack_3d80;
      vStack_3d78.m_value = 0;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0x36;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar23,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar20);
      pMVar11 = local_46d8;
      pMStack_3d80 = (XprTypeNested)local_1460;
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      peStack_3d90 = (element_type *)local_46d8;
      vStack_3d78.m_value = 0x12;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0x36;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar23,0x12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar22);
      pMVar6 = local_46e0;
      pMStack_3d80 = (XprTypeNested)local_1460;
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      peStack_3d90 = (element_type *)local_46e0;
      vStack_3d78.m_value = 0x24;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0x36;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar23,0x24);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar22);
      vStack_4aa0.m_value = vStack_4840.m_value;
      peStack_4a98 = (element_type *)sStack_4838.m_other;
      local_4ac0._0_8_ = local_4860._0_8_;
      local_4ac0._8_8_ = local_4860._8_8_;
      LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
      vStack_4aa8.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,xpr_00
                 ,lVar25,lVar20);
      sStack_3d30.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_3d28 = (element_type *)
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_3d50 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_3d48 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_3d40 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_3d38.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_3da0._8_8_ = vStack_4aa0.m_value;
      auStack_3da0._0_8_ = vStack_4aa8.m_value;
      peStack_3d90 = peStack_4a98;
      local_3dc0._8_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)local_4ac0._8_8_;
      vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
      vStack_3d78.m_value = (long)local_1460;
      sStack_3d88.m_other = (double)pMVar11;
      vStack_3d70.m_value = 0x12;
      local_3d68.m_value = 0;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)pMVar6;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 0.0;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar23,0x36);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar22);
      vStack_4aa0.m_value = vStack_4840.m_value;
      peStack_4a98 = (element_type *)sStack_4838.m_other;
      local_4ac0._0_8_ = local_4860._0_8_;
      local_4ac0._8_8_ = local_4860._8_8_;
      LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
      vStack_4aa8.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,xpr_00
                 ,lVar25,startCol);
      vStack_3d78.m_value = (long)local_1460;
      sStack_3d30.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_3d28 = (element_type *)
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_3d50 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_3d48 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_3d40 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_3d38.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_3da0._8_8_ = vStack_4aa0.m_value;
      auStack_3da0._0_8_ = vStack_4aa8.m_value;
      peStack_3d90 = peStack_4a98;
      local_3dc0._8_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)local_4ac0._8_8_;
      vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)pMVar6;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 0.0;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      sStack_3d88.m_other = (double)vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar23,0x48);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar20);
      vStack_4aa0.m_value = vStack_4840.m_value;
      peStack_4a98 = (element_type *)sStack_4838.m_other;
      local_4ac0._0_8_ = local_4860._0_8_;
      local_4ac0._8_8_ = local_4860._8_8_;
      LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
      vStack_4aa8.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,xpr_00
                 ,lVar25,startCol);
      vStack_3d78.m_value = (long)local_1460;
      sStack_3d30.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_3d28 = (element_type *)
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_3d50 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_3d48 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_3d40 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_3d38.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_3da0._8_8_ = vStack_4aa0.m_value;
      auStack_3da0._0_8_ = vStack_4aa8.m_value;
      peStack_3d90 = peStack_4a98;
      local_3dc0._8_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)local_4ac0._8_8_;
      vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 0;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)pMVar11;
      local_3d08.m_value = 0x12;
      local_3d00.m_other = 0.0;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      sStack_3d88.m_other = (double)vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar23,0x5a);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,startCol);
      pMStack_3d80 = (XprTypeNested)local_1460;
      lVar1 = lVar23 + 1;
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      peStack_3d90 = (element_type *)local_4c20;
      vStack_3d78.m_value = 0;
      vStack_3d70.m_value = 1;
      local_3d68.m_value = 0x36;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar20);
      pMStack_3d80 = (XprTypeNested)local_1460;
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      peStack_3d90 = (element_type *)local_4c18;
      vStack_3d78.m_value = 0x12;
      vStack_3d70.m_value = 1;
      local_3d68.m_value = 0x36;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar22);
      pMStack_3d80 = (XprTypeNested)local_1460;
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      peStack_3d90 = (element_type *)local_4c10;
      vStack_3d78.m_value = 0x24;
      vStack_3d70.m_value = 1;
      local_3d68.m_value = 0x36;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x24);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar22);
      vStack_4aa0.m_value = vStack_4840.m_value;
      peStack_4a98 = (element_type *)sStack_4838.m_other;
      local_4ac0._0_8_ = local_4860._0_8_;
      local_4ac0._8_8_ = local_4860._8_8_;
      LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
      vStack_4aa8.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,xpr_00
                 ,lVar25,lVar20);
      vStack_3d78.m_value = (long)local_1460;
      sStack_3d30.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_3d28 = (element_type *)
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_3d50 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_3d48 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_3d40 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_3d38.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_3da0._8_8_ = vStack_4aa0.m_value;
      auStack_3da0._0_8_ = vStack_4aa8.m_value;
      peStack_3d90 = peStack_4a98;
      local_3dc0._8_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)local_4ac0._8_8_;
      vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
      sStack_3d88.m_other = (double)local_4c18;
      vStack_3d70.m_value = 0x12;
      local_3d68.m_value = 1;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)local_4c10;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 4.94065645841247e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x36);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar22);
      vStack_4aa0.m_value = vStack_4840.m_value;
      peStack_4a98 = (element_type *)sStack_4838.m_other;
      local_4ac0._0_8_ = local_4860._0_8_;
      local_4ac0._8_8_ = local_4860._8_8_;
      LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
      vStack_4aa8.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,xpr_00
                 ,lVar25,startCol);
      vStack_3d78.m_value = (long)local_1460;
      sStack_3d30.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_3d28 = (element_type *)
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_3d50 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_3d48 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_3d40 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_3d38.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_3da0._8_8_ = vStack_4aa0.m_value;
      auStack_3da0._0_8_ = vStack_4aa8.m_value;
      peStack_3d90 = peStack_4a98;
      local_3dc0._8_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)local_4ac0._8_8_;
      vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
      sStack_3d88.m_other = (double)local_4c20;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 1;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)local_4c10;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 4.94065645841247e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x48);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar20);
      vStack_4aa0.m_value = vStack_4840.m_value;
      peStack_4a98 = (element_type *)sStack_4838.m_other;
      local_4ac0._0_8_ = local_4860._0_8_;
      local_4ac0._8_8_ = local_4860._8_8_;
      LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
      vStack_4aa8.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,xpr_00
                 ,lVar25,startCol);
      vStack_3d78.m_value = (long)local_1460;
      sStack_3d30.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_3d28 = (element_type *)
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_3d50 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_3d48 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_3d40 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_3d38.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_3da0._8_8_ = vStack_4aa0.m_value;
      auStack_3da0._0_8_ = vStack_4aa8.m_value;
      peStack_3d90 = peStack_4a98;
      local_3dc0._8_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)local_4ac0._8_8_;
      vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
      sStack_3d88.m_other = (double)local_4c20;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 1;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)local_4c18;
      local_3d08.m_value = 0x12;
      local_3d00.m_other = 4.94065645841247e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x5a);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,startCol);
      pMStack_3d80 = (XprTypeNested)local_1460;
      lVar1 = lVar23 + 2;
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      peStack_3d90 = (element_type *)local_4c38;
      vStack_3d78.m_value = 0;
      vStack_3d70.m_value = 2;
      local_3d68.m_value = 0x36;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar20);
      pMStack_3d80 = (XprTypeNested)local_1460;
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      peStack_3d90 = (element_type *)local_4c30;
      vStack_3d78.m_value = 0x12;
      vStack_3d70.m_value = 2;
      local_3d68.m_value = 0x36;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4ac0,xpr_00,
                 lVar25,lVar22);
      pMStack_3d80 = (XprTypeNested)local_1460;
      auStack_3da0._8_8_ = peStack_4a98;
      auStack_3da0._0_8_ = vStack_4aa0.m_value;
      local_3dc0._8_8_ = local_4ac0._8_8_;
      local_3dc0._0_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
      vStack_3da8.m_value = vStack_4aa8.m_value;
      peStack_3d90 = (element_type *)local_4c28;
      vStack_3d78.m_value = 0x24;
      vStack_3d70.m_value = 2;
      local_3d68.m_value = 0x36;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x24);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar22);
      vStack_4aa0.m_value = vStack_4840.m_value;
      peStack_4a98 = (element_type *)sStack_4838.m_other;
      local_4ac0._0_8_ = local_4860._0_8_;
      local_4ac0._8_8_ = local_4860._8_8_;
      LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
      vStack_4aa8.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,xpr_00
                 ,lVar25,lVar20);
      sStack_3d30.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_3d28 = (element_type *)
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_3d50 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_3d48 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_3d40 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_3d38.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_3da0._8_8_ = vStack_4aa0.m_value;
      auStack_3da0._0_8_ = vStack_4aa8.m_value;
      peStack_3d90 = peStack_4a98;
      local_3dc0._8_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)local_4ac0._8_8_;
      vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
      vStack_3d78.m_value = (long)local_1460;
      sStack_3d88.m_other = (double)local_4c30;
      vStack_3d70.m_value = 0x12;
      local_3d68.m_value = 2;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)local_4c28;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 9.88131291682493e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x36);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar22);
      vStack_4aa0.m_value = vStack_4840.m_value;
      peStack_4a98 = (element_type *)sStack_4838.m_other;
      local_4ac0._0_8_ = local_4860._0_8_;
      local_4ac0._8_8_ = local_4860._8_8_;
      LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
      vStack_4aa8.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,xpr_00
                 ,lVar25,startCol);
      sStack_3d30.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_3d28 = (element_type *)
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_3d50 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_3d48 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_3d40 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_3d38.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_3da0._8_8_ = vStack_4aa0.m_value;
      auStack_3da0._0_8_ = vStack_4aa8.m_value;
      peStack_3d90 = peStack_4a98;
      local_3dc0._8_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)local_4ac0._8_8_;
      vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
      vStack_3d78.m_value = (long)local_1460;
      sStack_3d88.m_other = (double)local_4c38;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 2;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)local_4c28;
      local_3d08.m_value = 0x24;
      local_3d00.m_other = 9.88131291682493e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x48);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_4860,xpr_00,
                 lVar25,lVar20);
      vStack_4aa0.m_value = vStack_4840.m_value;
      peStack_4a98 = (element_type *)sStack_4838.m_other;
      local_4ac0._0_8_ = local_4860._0_8_;
      local_4ac0._8_8_ = local_4860._8_8_;
      LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
      vStack_4aa8.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)&local_4be0,xpr_00
                 ,lVar25,startCol);
      vStack_3d78.m_value = (long)local_1460;
      sStack_3d30.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[4];
      peStack_3d28 = (element_type *)
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array[5];
      local_3d50 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[0];
      local_3d48 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[1];
      local_3d40 = (element_type *)
                   local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage
                   .m_data.array[2];
      sStack_3d38.m_other =
           local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
           array[3];
      auStack_3da0._8_8_ = vStack_4aa0.m_value;
      auStack_3da0._0_8_ = vStack_4aa8.m_value;
      peStack_3d90 = peStack_4a98;
      local_3dc0._8_8_ = local_4ac0._0_8_;
      sStack_3db0.m_other = (double)local_4ac0._8_8_;
      vStack_3da8.m_value = (long)LStack_4ab0.m_matrix;
      sStack_3d88.m_other = (double)local_4c38;
      vStack_3d70.m_value = 0;
      local_3d68.m_value = 2;
      sStack_3d60.m_other = 2.66795448754273e-322;
      local_3d20 = (XprTypeNested)local_4c30;
      local_3d08.m_value = 0x12;
      local_3d00.m_other = 9.88131291682493e-324;
      local_3cf8 = (RhsNested)0x36;
      local_3d10.m_value = vStack_3d78.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,lVar1,0x5a);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,54,3,0,54,3>,18,1,false>>const>const>>
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_54,_3,_0,_54,_3>,_18,_1,_false>_>_>_>
                  *)local_3dc0);
      lVar25 = lVar25 + 1;
      lVar23 = lVar23 + 3;
      H = (ChMatrixRef *)local_4c98;
    }
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               local_3dc0,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               ((local_4870->m_layers).
                super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                ._M_impl.super__Vector_impl_data._M_start + local_4c48));
    memcpy(&local_4be0,(ChMatrixNM<double,_6,_6> *)(local_3dc0._0_8_ + 0x20),0x120);
    this_01 = (ChElementShellANCF_3833 *)(local_3dc0 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
    RotateReorderStiffnessMatrix
              (this_01,&local_4be0,
               (pCVar9->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1].m_theta);
    local_4c60.m_storage.m_cols = 0;
    local_4c60.m_storage.m_data = (double *)0x0;
    local_4c60.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_4c60,0x48,0x6c)
    ;
    puVar10 = local_46f0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3e50,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_44f0,(double *)&local_4be0,(StorageBaseType *)&local_3e50);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3f10,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x12);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4460,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 1,(StorageBaseType *)&local_3f10);
    uVar13 = local_4460._16_8_;
    uVar12 = local_44f0._16_8_;
    local_45c0._0_8_ = local_44d8;
    local_45c0._8_8_ = dStack_44d0;
    pMStack_45b0 = pMStack_44c8;
    lStack_45a8 = vStack_44c0.m_value;
    dStack_45a0 = (double)vStack_44b8.m_value;
    pMStack_4598 = pMStack_44b0;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [0] = (double)local_4448;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [1] = (double)pMStack_4440;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4438;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4430.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4428.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [5] = dStack_4420;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_3fd0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x24);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_42b0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 2,(StorageBaseType *)local_3fd0);
    dVar18 = dStack_4270;
    vVar17.m_value = vStack_4278.m_value;
    vVar16.m_value = vStack_4280.m_value;
    pMVar11 = pMStack_4288;
    dVar15 = dStack_4290;
    pdVar14 = local_4298;
    sStack_46b0.m_other = (double)uVar12;
    sStack_4688.m_other = dStack_45a0;
    pMStack_4680 = pMStack_4598;
    peStack_46a8 = (element_type *)local_45c0._0_8_;
    dStack_46a0 = (double)local_45c0._8_8_;
    pMStack_4698 = pMStack_45b0;
    lStack_4690 = lStack_45a8;
    local_4660 = (double)uVar13;
    dStack_4638 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[4];
    dStack_4630 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[5];
    sStack_4658.m_other =
         local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.
         array[0];
    pMStack_4650 = (RhsNested)
                   local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                   m_storage.m_data.array[1];
    local_4648 = (XprTypeNested)
                 local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage
                 .m_data.array[2];
    dStack_4640 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[3];
    local_4608 = (double)local_42b0._16_8_;
    puVar10[2] = pMStack_4288;
    puVar10[3] = vVar16.m_value;
    puVar10[4] = vVar17.m_value;
    puVar10[5] = dVar18;
    *puVar10 = pdVar14;
    puVar10[1] = dVar15;
    puVar10[2] = pMVar11;
    puVar10[3] = vVar16.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_4340,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x36);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4060,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 3,(StorageBaseType *)local_4340);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4060);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_43d0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x48);
    Eigen::operator*(&local_40f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 4,(StorageBaseType *)&local_43d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_40f0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_48f0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x5a);
    Eigen::operator*(&local_4180,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 5,(StorageBaseType *)local_48f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<_cefa6b9_> *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_4180);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c60,0,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (CwiseBinaryOp<_cefa6b9_> *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3e50,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_44f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 6,(StorageBaseType *)&local_3e50);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3f10,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x12);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4460,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 7,(StorageBaseType *)&local_3f10);
    uVar13 = local_4460._16_8_;
    uVar12 = local_44f0._16_8_;
    local_45c0._0_8_ = local_44d8;
    local_45c0._8_8_ = dStack_44d0;
    pMStack_45b0 = pMStack_44c8;
    lStack_45a8 = vStack_44c0.m_value;
    dStack_45a0 = (double)vStack_44b8.m_value;
    pMStack_4598 = pMStack_44b0;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [0] = (double)local_4448;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [1] = (double)pMStack_4440;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4438;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4430.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4428.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [5] = dStack_4420;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_3fd0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x24);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_42b0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 8,(StorageBaseType *)local_3fd0);
    dVar18 = dStack_4270;
    vVar17.m_value = vStack_4278.m_value;
    vVar16.m_value = vStack_4280.m_value;
    pMVar11 = pMStack_4288;
    dVar15 = dStack_4290;
    pdVar14 = local_4298;
    sStack_46b0.m_other = (double)uVar12;
    sStack_4688.m_other = dStack_45a0;
    pMStack_4680 = pMStack_4598;
    peStack_46a8 = (element_type *)local_45c0._0_8_;
    dStack_46a0 = (double)local_45c0._8_8_;
    pMStack_4698 = pMStack_45b0;
    lStack_4690 = lStack_45a8;
    local_4660 = (double)uVar13;
    dStack_4638 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[4];
    dStack_4630 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[5];
    sStack_4658.m_other =
         local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.
         array[0];
    pMStack_4650 = (RhsNested)
                   local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                   m_storage.m_data.array[1];
    local_4648 = (XprTypeNested)
                 local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage
                 .m_data.array[2];
    dStack_4640 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[3];
    local_4608 = (double)local_42b0._16_8_;
    puVar10[2] = pMStack_4288;
    puVar10[3] = vVar16.m_value;
    puVar10[4] = vVar17.m_value;
    puVar10[5] = dVar18;
    *puVar10 = pdVar14;
    puVar10[1] = dVar15;
    puVar10[2] = pMVar11;
    puVar10[3] = vVar16.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_4340,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x36);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4060,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 9,(StorageBaseType *)local_4340);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4060);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_43d0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x48);
    Eigen::operator*(&local_40f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 10,(StorageBaseType *)&local_43d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_40f0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_48f0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x5a);
    Eigen::operator*(&local_4180,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb,(StorageBaseType *)local_48f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<_cefa6b9_> *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_4180);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c60,0,0x12);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (CwiseBinaryOp<_cefa6b9_> *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3e50,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_44f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xc,(StorageBaseType *)&local_3e50);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3f10,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x12);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4460,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd,(StorageBaseType *)&local_3f10);
    uVar13 = local_4460._16_8_;
    uVar12 = local_44f0._16_8_;
    local_45c0._0_8_ = local_44d8;
    local_45c0._8_8_ = dStack_44d0;
    pMStack_45b0 = pMStack_44c8;
    lStack_45a8 = vStack_44c0.m_value;
    dStack_45a0 = (double)vStack_44b8.m_value;
    pMStack_4598 = pMStack_44b0;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [0] = (double)local_4448;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [1] = (double)pMStack_4440;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4438;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4430.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4428.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [5] = dStack_4420;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_3fd0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x24);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_42b0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe,(StorageBaseType *)local_3fd0);
    dVar18 = dStack_4270;
    vVar17.m_value = vStack_4278.m_value;
    vVar16.m_value = vStack_4280.m_value;
    pMVar11 = pMStack_4288;
    dVar15 = dStack_4290;
    pdVar14 = local_4298;
    sStack_46b0.m_other = (double)uVar12;
    sStack_4688.m_other = dStack_45a0;
    pMStack_4680 = pMStack_4598;
    peStack_46a8 = (element_type *)local_45c0._0_8_;
    dStack_46a0 = (double)local_45c0._8_8_;
    pMStack_4698 = pMStack_45b0;
    lStack_4690 = lStack_45a8;
    local_4660 = (double)uVar13;
    dStack_4638 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[4];
    dStack_4630 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[5];
    sStack_4658.m_other =
         local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.
         array[0];
    pMStack_4650 = (RhsNested)
                   local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                   m_storage.m_data.array[1];
    local_4648 = (XprTypeNested)
                 local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage
                 .m_data.array[2];
    dStack_4640 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[3];
    local_4608 = (double)local_42b0._16_8_;
    puVar10[2] = pMStack_4288;
    puVar10[3] = vVar16.m_value;
    puVar10[4] = vVar17.m_value;
    puVar10[5] = dVar18;
    *puVar10 = pdVar14;
    puVar10[1] = dVar15;
    puVar10[2] = pMVar11;
    puVar10[3] = vVar16.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_4340,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x36);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4060,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf,(StorageBaseType *)local_4340);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4060);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_43d0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x48);
    Eigen::operator*(&local_40f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x10,(StorageBaseType *)&local_43d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_40f0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_48f0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x5a);
    Eigen::operator*(&local_4180,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x11,(StorageBaseType *)local_48f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<_cefa6b9_> *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_4180);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c60,0,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (CwiseBinaryOp<_cefa6b9_> *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3e50,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_44f0,local_4878,(StorageBaseType *)&local_3e50);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3f10,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x12);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4460,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x13,(StorageBaseType *)&local_3f10);
    uVar13 = local_4460._16_8_;
    uVar12 = local_44f0._16_8_;
    local_45c0._0_8_ = local_44d8;
    local_45c0._8_8_ = dStack_44d0;
    pMStack_45b0 = pMStack_44c8;
    lStack_45a8 = vStack_44c0.m_value;
    dStack_45a0 = (double)vStack_44b8.m_value;
    pMStack_4598 = pMStack_44b0;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [0] = (double)local_4448;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [1] = (double)pMStack_4440;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4438;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4430.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4428.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [5] = dStack_4420;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_3fd0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x24);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_42b0,local_4880,(StorageBaseType *)local_3fd0);
    dVar18 = dStack_4270;
    vVar17.m_value = vStack_4278.m_value;
    vVar16.m_value = vStack_4280.m_value;
    pMVar11 = pMStack_4288;
    dVar15 = dStack_4290;
    pdVar14 = local_4298;
    sStack_46b0.m_other = (double)uVar12;
    sStack_4688.m_other = dStack_45a0;
    pMStack_4680 = pMStack_4598;
    peStack_46a8 = (element_type *)local_45c0._0_8_;
    dStack_46a0 = (double)local_45c0._8_8_;
    pMStack_4698 = pMStack_45b0;
    lStack_4690 = lStack_45a8;
    local_4660 = (double)uVar13;
    dStack_4638 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[4];
    dStack_4630 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[5];
    sStack_4658.m_other =
         local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.
         array[0];
    pMStack_4650 = (RhsNested)
                   local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                   m_storage.m_data.array[1];
    local_4648 = (XprTypeNested)
                 local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage
                 .m_data.array[2];
    dStack_4640 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[3];
    local_4608 = (double)local_42b0._16_8_;
    puVar10[2] = pMStack_4288;
    puVar10[3] = vVar16.m_value;
    puVar10[4] = vVar17.m_value;
    puVar10[5] = dVar18;
    *puVar10 = pdVar14;
    puVar10[1] = dVar15;
    puVar10[2] = pMVar11;
    puVar10[3] = vVar16.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_4340,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x36);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4060,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x15,(StorageBaseType *)local_4340);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4060);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_43d0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x48);
    Eigen::operator*(&local_40f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x16,(StorageBaseType *)&local_43d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_40f0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_48f0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x5a);
    Eigen::operator*(&local_4180,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x17,(StorageBaseType *)local_48f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<_cefa6b9_> *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_4180);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c60,0,0x36);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (CwiseBinaryOp<_cefa6b9_> *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3e50,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_44f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x18,(StorageBaseType *)&local_3e50);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3f10,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x12);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4460,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x19,(StorageBaseType *)&local_3f10);
    uVar13 = local_4460._16_8_;
    uVar12 = local_44f0._16_8_;
    local_45c0._0_8_ = local_44d8;
    local_45c0._8_8_ = dStack_44d0;
    pMStack_45b0 = pMStack_44c8;
    lStack_45a8 = vStack_44c0.m_value;
    dStack_45a0 = (double)vStack_44b8.m_value;
    pMStack_4598 = pMStack_44b0;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [0] = (double)local_4448;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [1] = (double)pMStack_4440;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4438;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4430.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4428.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [5] = dStack_4420;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_3fd0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x24);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_42b0,local_4888,(StorageBaseType *)local_3fd0);
    dVar18 = dStack_4270;
    vVar17.m_value = vStack_4278.m_value;
    vVar16.m_value = vStack_4280.m_value;
    pMVar11 = pMStack_4288;
    dVar15 = dStack_4290;
    pdVar14 = local_4298;
    sStack_46b0.m_other = (double)uVar12;
    sStack_4688.m_other = dStack_45a0;
    pMStack_4680 = pMStack_4598;
    peStack_46a8 = (element_type *)local_45c0._0_8_;
    dStack_46a0 = (double)local_45c0._8_8_;
    pMStack_4698 = pMStack_45b0;
    lStack_4690 = lStack_45a8;
    local_4660 = (double)uVar13;
    dStack_4638 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[4];
    dStack_4630 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[5];
    sStack_4658.m_other =
         local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.
         array[0];
    pMStack_4650 = (RhsNested)
                   local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                   m_storage.m_data.array[1];
    local_4648 = (XprTypeNested)
                 local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage
                 .m_data.array[2];
    dStack_4640 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[3];
    local_4608 = (double)local_42b0._16_8_;
    puVar10[2] = pMStack_4288;
    puVar10[3] = vVar16.m_value;
    puVar10[4] = vVar17.m_value;
    puVar10[5] = dVar18;
    *puVar10 = pdVar14;
    puVar10[1] = dVar15;
    puVar10[2] = pMVar11;
    puVar10[3] = vVar16.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_4340,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x36);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4060,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1b,(StorageBaseType *)local_4340);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4060);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_43d0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x48);
    Eigen::operator*(&local_40f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1c,(StorageBaseType *)&local_43d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_40f0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_48f0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x5a);
    Eigen::operator*(&local_4180,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1d,(StorageBaseType *)local_48f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<_cefa6b9_> *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_4180);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c60,0,0x48);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (CwiseBinaryOp<_cefa6b9_> *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3e50,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_44f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1e,(StorageBaseType *)&local_3e50);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_3f10,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x12);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4460,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1f,(StorageBaseType *)&local_3f10);
    uVar13 = local_4460._16_8_;
    uVar12 = local_44f0._16_8_;
    local_45c0._0_8_ = local_44d8;
    local_45c0._8_8_ = dStack_44d0;
    pMStack_45b0 = pMStack_44c8;
    lStack_45a8 = vStack_44c0.m_value;
    dStack_45a0 = (double)vStack_44b8.m_value;
    pMStack_4598 = pMStack_44b0;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [0] = (double)local_4448;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [1] = (double)pMStack_4440;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [2] = (double)pMStack_4438;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = (double)vStack_4430.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_4428.m_value;
    local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [5] = dStack_4420;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_3fd0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x24);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_42b0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x20,(StorageBaseType *)local_3fd0);
    dVar18 = dStack_4270;
    vVar17.m_value = vStack_4278.m_value;
    vVar16.m_value = vStack_4280.m_value;
    pMVar11 = pMStack_4288;
    dVar15 = dStack_4290;
    pdVar14 = local_4298;
    sStack_46b0.m_other = (double)uVar12;
    sStack_4688.m_other = dStack_45a0;
    pMStack_4680 = pMStack_4598;
    peStack_46a8 = (element_type *)local_45c0._0_8_;
    dStack_46a0 = (double)local_45c0._8_8_;
    pMStack_4698 = pMStack_45b0;
    lStack_4690 = lStack_45a8;
    local_4660 = (double)uVar13;
    dStack_4638 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[4];
    dStack_4630 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[5];
    sStack_4658.m_other =
         local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.
         array[0];
    pMStack_4650 = (RhsNested)
                   local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                   m_storage.m_data.array[1];
    local_4648 = (XprTypeNested)
                 local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage
                 .m_data.array[2];
    dStack_4640 = local_4220.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.
                  m_storage.m_data.array[3];
    local_4608 = (double)local_42b0._16_8_;
    puVar10[2] = pMStack_4288;
    puVar10[3] = vVar16.m_value;
    puVar10[4] = vVar17.m_value;
    puVar10[5] = dVar18;
    *puVar10 = pdVar14;
    puVar10[1] = dVar15;
    puVar10[2] = pMVar11;
    puVar10[3] = vVar16.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_4340,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x36);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>
                      *)local_4060,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x21,(StorageBaseType *)local_4340);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4060);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_43d0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x48);
    Eigen::operator*(&local_40f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x22,(StorageBaseType *)&local_43d0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_40f0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)local_48f0,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c00,0,0x5a);
    Eigen::operator*(&local_4180,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x23,(StorageBaseType *)local_48f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,72,18,false>const>const>>
    ::operator+((CwiseBinaryOp<_cefa6b9_> *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_72,_18,_1,_72,_18>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false>_>_>
                 *)&local_4180);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_72,_18,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (Matrix<double,__1,__1,_1,__1,__1> *)&local_4c60,0,0x5a);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,72,18,1,72,18>const>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,72,18,false>const>const>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_72,_18,_false> *)&local_4c90,
               (CwiseBinaryOp<_cefa6b9_> *)local_3dc0);
    local_4ac0._0_8_ = &local_4c60;
    local_3dc0 = (undefined1  [16])
                 Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_4cf0,
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                             *)local_4ac0);
    local_4860._0_8_ = H;
    Eigen::
    NoAlias<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,Eigen::MatrixBase>
    ::operator+=((NoAlias<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::MatrixBase>
                  *)local_4860,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>_>
                  *)local_3dc0);
    peVar5 = local_4cc0;
    ppCVar4 = local_4cc8;
    _auStack_3da0 = ZEXT824((XprTypeNested)local_f20);
    pMStack_3d80 = (XprTypeNested)local_a10;
    sStack_3d88.m_other = 2.66795448754273e-322;
    local_3ca8 = (Matrix<double,__1,__1,_1,__1,__1> *)(local_8f0 + 0x240);
    local_3d18.m_value = (long)(local_8f0 + 0x90);
    local_3d68.m_value = 0;
    sStack_3d60.m_other = 1.48219693752374e-323;
    local_3d58 = (XprTypeNested)0x36;
    local_3d48 = local_4cc0;
    sStack_3d30.m_other = 0.0;
    peStack_3d28 = (element_type *)0x1;
    local_3d20 = (XprTypeNested)0x36;
    local_3d00.m_other = 0.0;
    local_3cf8 = (RhsNested)0x4;
    local_3cf0 = (XprTypeNested)0x36;
    local_3cd8 = (Matrix<double,__1,__1,_1,__1,__1> *)local_4cc8;
    local_3cc0.m_value = 0;
    local_3cb8.m_value = 2;
    local_3cb0 = (XprTypeNested)0x36;
    local_3c90 = (undefined1 *)0x0;
    local_3c88.m_other = 2.47032822920623e-323;
    local_3c80 = (XprTypeNested)0x36;
    sStack_3db0.m_other = (double)local_f20;
    vStack_3d70.m_value = (long)local_f20;
    sStack_3d38.m_other = (double)local_f20;
    local_3d08.m_value = (long)local_f20;
    local_3cc8 = (XprTypeNested)local_f20;
    local_3c98 = (XprTypeNested)local_f20;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_44f0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    _auStack_3da0 = ZEXT824((XprTypeNested)local_f20);
    sStack_3d88.m_other = 2.66795448754273e-322;
    local_3d68.m_value = 0;
    sStack_3d60.m_other = 0.0;
    local_3d58 = (XprTypeNested)0x36;
    local_3d48 = peVar5;
    sStack_3d30.m_other = 0.0;
    peStack_3d28 = (element_type *)0x1;
    local_3d20 = (XprTypeNested)0x36;
    local_3d18.m_value = (long)peVar5;
    local_3d00.m_other = 0.0;
    local_3cf8 = (RhsNested)0x1;
    local_3cf0 = (XprTypeNested)0x36;
    local_3cd8 = (Matrix<double,__1,__1,_1,__1,__1> *)ppCVar4;
    local_3cc0.m_value = 0;
    local_3cb8.m_value = 2;
    local_3cb0 = (XprTypeNested)0x36;
    local_3ca8 = (Matrix<double,__1,__1,_1,__1,__1> *)ppCVar4;
    local_3c90 = (undefined1 *)0x0;
    local_3c88.m_other = 9.88131291682493e-324;
    local_3c80 = (XprTypeNested)0x36;
    sStack_3db0.m_other = (double)local_f20;
    pMStack_3d80 = (XprTypeNested)local_f20;
    vStack_3d70.m_value = (long)local_f20;
    sStack_3d38.m_other = (double)local_f20;
    local_3d08.m_value = (long)local_f20;
    local_3cc8 = (XprTypeNested)local_f20;
    local_3c98 = (XprTypeNested)local_f20;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_4460,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    local_3dc0._0_8_ = &DAT_3ff0000000000000;
    local_4ac0._0_8_ = (element_type *)local_4460;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_> *)
               local_4ac0,(Scalar *)local_3dc0);
    local_3dc0._0_8_ = (element_type *)0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_> *)local_4460,(Scalar *)local_3dc0
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_3dc0,local_4cd0,(StorageBaseType *)local_44f0);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_4460,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)local_4ac0,xpr,
               lVar24,0);
    local_4860._0_8_ = local_4460;
    auStack_3da0._8_8_ = peStack_4a98;
    auStack_3da0._0_8_ = vStack_4aa0.m_value;
    local_3dc0._0_8_ = local_4ac0._0_8_;
    local_3dc0._8_8_ = local_4ac0._8_8_;
    sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
    vStack_3da8.m_value = vStack_4aa8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_4860,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_3dc0);
    pMVar7 = local_4ca0;
    sStack_3db0.m_other = (double)local_4ca0;
    auStack_3da0._8_8_ = 0x12;
    auStack_3da0._0_8_ = (RhsNested)local_f20;
    peStack_3d90 = (element_type *)0x0;
    pMStack_3d80 = (XprTypeNested)(local_a10 + 0x90);
    sStack_3d88.m_other = 2.66795448754273e-322;
    local_3d18.m_value = (long)(local_8f0 + 0x120);
    local_3d68.m_value = 0x12;
    sStack_3d60.m_other = 1.48219693752374e-323;
    local_3d58 = (XprTypeNested)0x36;
    local_3ca8 = (Matrix<double,__1,__1,_1,__1,__1> *)(local_8f0 + 0x2d0);
    sStack_3d30.m_other = 8.89318162514244e-323;
    peStack_3d28 = (element_type *)0x1;
    local_3d20 = (XprTypeNested)0x36;
    local_3d00.m_other = 8.89318162514244e-323;
    local_3cf8 = (RhsNested)0x4;
    local_3cf0 = (XprTypeNested)0x36;
    local_3cc0.m_value = 0x12;
    local_3cb8.m_value = 2;
    local_3cb0 = (XprTypeNested)0x36;
    local_3c90 = (undefined1 *)0x12;
    local_3c88.m_other = 2.47032822920623e-323;
    local_3c80 = (XprTypeNested)0x36;
    local_4ac0._0_8_ = local_44f0;
    vStack_3d70.m_value = (long)local_f20;
    local_3d48 = (element_type *)local_ce0;
    sStack_3d38.m_other = (double)local_f20;
    local_3d08.m_value = (long)local_f20;
    local_3cd8 = local_b30;
    local_3cc8 = (XprTypeNested)local_f20;
    local_3c98 = (XprTypeNested)local_f20;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)local_4ac0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    sStack_3db0.m_other = (double)pMVar7;
    auStack_3da0._8_8_ = 0x12;
    peStack_3d90 = (element_type *)0x0;
    sStack_3d88.m_other = 2.66795448754273e-322;
    pMStack_3d80 = pMVar7;
    local_3d68.m_value = 0x12;
    sStack_3d60.m_other = 0.0;
    local_3d58 = (XprTypeNested)0x36;
    sStack_3d30.m_other = 8.89318162514244e-323;
    peStack_3d28 = (element_type *)0x1;
    local_3d20 = (XprTypeNested)0x36;
    local_3d00.m_other = 8.89318162514244e-323;
    local_3cf8 = (RhsNested)0x1;
    local_3cf0 = (XprTypeNested)0x36;
    local_3cc0.m_value = 0x12;
    local_3cb8.m_value = 2;
    local_3cb0 = (XprTypeNested)0x36;
    local_3c90 = (undefined1 *)0x12;
    local_3c88.m_other = 9.88131291682493e-324;
    local_3c80 = (XprTypeNested)0x36;
    vStack_3d70.m_value = (long)local_f20;
    local_3d48 = (element_type *)local_ce0;
    sStack_3d38.m_other = (double)local_f20;
    local_3d18.m_value = (long)local_ce0;
    local_3d08.m_value = (long)local_f20;
    local_3cd8 = local_b30;
    local_3cc8 = (XprTypeNested)local_f20;
    local_3ca8 = local_b30;
    local_3c98 = (XprTypeNested)local_f20;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_42b0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    local_3dc0._0_8_ = &DAT_3ff0000000000000;
    local_4ac0._0_8_ = (element_type *)local_42b0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_> *)
               local_4ac0,(Scalar *)local_3dc0);
    local_3dc0._0_8_ = (element_type *)0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_> *)local_42b0,(Scalar *)local_3dc0
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_3dc0,local_4cd0,(StorageBaseType *)local_44f0);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_42b0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)local_4ac0,xpr,
               lVar24,0);
    local_4860._0_8_ = local_42b0;
    auStack_3da0._8_8_ = peStack_4a98;
    auStack_3da0._0_8_ = vStack_4aa0.m_value;
    local_3dc0._0_8_ = local_4ac0._0_8_;
    local_3dc0._8_8_ = local_4ac0._8_8_;
    sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
    vStack_3da8.m_value = vStack_4aa8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_4860,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_3dc0);
    pMVar7 = local_4ca8;
    pMVar6 = local_4cb0;
    sStack_3db0.m_other = (double)local_4ca8;
    auStack_3da0._8_8_ = 0x24;
    auStack_3da0._0_8_ = (RhsNested)local_f20;
    peStack_3d90 = (element_type *)0x0;
    pMStack_3d80 = (XprTypeNested)local_8f0;
    sStack_3d88.m_other = 2.66795448754273e-322;
    local_3ca8 = (Matrix<double,__1,__1,_1,__1,__1> *)(local_8f0 + 0x360);
    local_3d18.m_value = (long)(local_8f0 + 0x1b0);
    local_3d68.m_value = 0x24;
    sStack_3d60.m_other = 1.48219693752374e-323;
    local_3d58 = (XprTypeNested)0x36;
    local_3d48 = (element_type *)local_4cb0;
    sStack_3d30.m_other = 1.77863632502849e-322;
    peStack_3d28 = (element_type *)0x1;
    local_3d20 = (XprTypeNested)0x36;
    local_3d00.m_other = 1.77863632502849e-322;
    local_3cf8 = (RhsNested)0x4;
    local_3cf0 = (XprTypeNested)0x36;
    local_3cd8 = local_4cb8;
    local_3cc0.m_value = 0x24;
    local_3cb8.m_value = 2;
    local_3cb0 = (XprTypeNested)0x36;
    local_3c90 = (undefined1 *)0x24;
    local_3c88.m_other = 2.47032822920623e-323;
    local_3c80 = (XprTypeNested)0x36;
    local_4ac0._0_8_ = local_44f0;
    vStack_3d70.m_value = (long)local_f20;
    sStack_3d38.m_other = (double)local_f20;
    local_3d08.m_value = (long)local_f20;
    local_3cc8 = (XprTypeNested)local_f20;
    local_3c98 = (XprTypeNested)local_f20;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)local_4ac0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    sStack_3db0.m_other = (double)pMVar7;
    auStack_3da0._8_8_ = 0x24;
    peStack_3d90 = (element_type *)0x0;
    sStack_3d88.m_other = 2.66795448754273e-322;
    pMStack_3d80 = pMVar7;
    local_3d68.m_value = 0x24;
    sStack_3d60.m_other = 0.0;
    local_3d58 = (XprTypeNested)0x36;
    local_3d48 = (element_type *)pMVar6;
    sStack_3d30.m_other = 1.77863632502849e-322;
    peStack_3d28 = (element_type *)0x1;
    local_3d20 = (XprTypeNested)0x36;
    local_3d18.m_value = (long)pMVar6;
    local_3d00.m_other = 1.77863632502849e-322;
    local_3cf8 = (RhsNested)0x1;
    local_3cf0 = (XprTypeNested)0x36;
    local_3cd8 = local_4cb8;
    local_3cc0.m_value = 0x24;
    local_3cb8.m_value = 2;
    local_3cb0 = (XprTypeNested)0x36;
    local_3ca8 = local_4cb8;
    local_3c90 = (undefined1 *)0x24;
    local_3c88.m_other = 9.88131291682493e-324;
    local_3c80 = (XprTypeNested)0x36;
    vStack_3d70.m_value = (long)local_f20;
    sStack_3d38.m_other = (double)local_f20;
    local_3d08.m_value = (long)local_f20;
    local_3cc8 = (XprTypeNested)local_f20;
    local_3c98 = (XprTypeNested)local_f20;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_4060,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    local_3dc0._0_8_ = &DAT_3ff0000000000000;
    local_4ac0._0_8_ = (element_type *)local_4060;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>::operator-=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_> *)
               local_4ac0,(Scalar *)local_3dc0);
    local_3dc0._0_8_ = (element_type *)0x3fe0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_> *)local_4060,(Scalar *)local_3dc0
              );
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_3dc0,local_4cd0,(StorageBaseType *)local_44f0);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_4060,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)local_4ac0,xpr,
               lVar24,0);
    local_4860._0_8_ = local_4060;
    auStack_3da0._8_8_ = peStack_4a98;
    auStack_3da0._0_8_ = vStack_4aa0.m_value;
    local_3dc0._0_8_ = local_4ac0._0_8_;
    local_3dc0._8_8_ = local_4ac0._8_8_;
    sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
    vStack_3da8.m_value = vStack_4aa8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_4860,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_3dc0);
    auStack_3da0._8_8_ = local_4ca8;
    sStack_3d88.m_other = (double)local_f20;
    pMStack_3d80 = (XprTypeNested)0x24;
    vStack_3d78.m_value = 0;
    local_3d68.m_value = (long)(local_a10 + 0x90);
    vStack_3d70.m_value = 0x36;
    local_3d50 = (element_type *)0x12;
    local_3d48 = (element_type *)0x3;
    local_3d40 = (element_type *)0x36;
    sStack_3d30.m_other = (double)local_4cb0;
    local_3d18.m_value = 0x24;
    local_3d00.m_other = (double)(local_8f0 + 0x120);
    local_3d10.m_value = 1;
    local_3d08.m_value = 0x36;
    local_3ce8 = 8.89318162514244e-323;
    local_3ce0.m_other = 1.97626258336499e-323;
    local_3cd8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x36;
    local_3cc0.m_value = (long)local_4cb8;
    local_3ca8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x24;
    local_3c90 = local_8f0 + 0x2d0;
    local_3ca0.m_other = 9.88131291682493e-324;
    local_3c98 = (XprTypeNested)0x36;
    local_3c78 = 8.89318162514244e-323;
    local_3c20 = local_8f0;
    local_3c70 = (XprTypeNested)0x5;
    local_3c68.m_value = 0x36;
    local_3c50 = local_4ca0;
    local_3c38 = 8.89318162514244e-323;
    sStack_3c30.m_other = 0.0;
    local_3c28 = (PointerType)0x36;
    local_3c08.m_value = 0x24;
    local_3c00 = 1.48219693752374e-323;
    local_3bf8 = 2.66795448754273e-322;
    local_3bc8 = 8.89318162514244e-323;
    local_3bc0 = (XprTypeNested)0x1;
    local_3bb0.m_value = (long)(local_8f0 + 0x1b0);
    local_3bb8.m_value = 0x36;
    local_3b98 = 1.77863632502849e-322;
    local_3b90 = 1.97626258336499e-323;
    local_3b88 = 2.66795448754273e-322;
    local_3b40 = local_8f0 + 0x360;
    local_4ac0._0_8_ = local_44f0;
    local_3b58 = 8.89318162514244e-323;
    local_3b50 = 9.88131291682493e-324;
    local_3b48 = 2.66795448754273e-322;
    local_3b28 = 1.77863632502849e-322;
    local_3b20 = 2.47032822920623e-323;
    local_3b18 = 2.66795448754273e-322;
    local_3d58 = (XprTypeNested)local_f20;
    local_3d20 = (XprTypeNested)local_f20;
    local_3cf0 = (XprTypeNested)local_f20;
    local_3cb0 = (XprTypeNested)local_f20;
    local_3c80 = (XprTypeNested)local_f20;
    local_3c40 = (XprTypeNested)local_f20;
    local_3c10.m_value = (long)local_f20;
    local_3be0 = (element_type *)local_ce0;
    local_3bd0 = (XprTypeNested)local_f20;
    local_3ba0 = (XprTypeNested)local_f20;
    local_3b70 = local_b30;
    local_3b60 = (XprTypeNested)local_f20;
    local_3b30 = (XprTypeNested)local_f20;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)local_4ac0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    pMVar6 = local_4cb8;
    sStack_3db0.m_other = (double)local_4ca0;
    auStack_3da0._8_8_ = 0x12;
    auStack_3da0._0_8_ = (RhsNested)local_f20;
    peStack_3d90 = (element_type *)0x0;
    sStack_3d88.m_other = 2.66795448754273e-322;
    pMStack_3d80 = local_4ca8;
    local_3d68.m_value = 0x24;
    sStack_3d60.m_other = 0.0;
    local_3d58 = (XprTypeNested)0x36;
    sStack_3d30.m_other = 8.89318162514244e-323;
    peStack_3d28 = (element_type *)0x1;
    local_3d20 = (XprTypeNested)0x36;
    local_3d18.m_value = (long)local_4cb0;
    local_3d00.m_other = 1.77863632502849e-322;
    local_3cf8 = (RhsNested)0x1;
    local_3cf0 = (XprTypeNested)0x36;
    local_3cc0.m_value = 0x12;
    local_3cb8.m_value = 2;
    local_3cb0 = (XprTypeNested)0x36;
    local_3ca8 = local_4cb8;
    local_3c90 = (undefined1 *)0x24;
    local_3c88.m_other = 9.88131291682493e-324;
    local_3c80 = (XprTypeNested)0x36;
    vStack_3d70.m_value = (long)local_f20;
    local_3d48 = (element_type *)local_ce0;
    sStack_3d38.m_other = (double)local_f20;
    local_3d08.m_value = (long)local_f20;
    local_3cd8 = local_b30;
    local_3cc8 = (XprTypeNested)local_f20;
    local_3c98 = (XprTypeNested)local_f20;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_40f0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_3dc0,local_4cd0,(StorageBaseType *)local_44f0);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_40f0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)local_4ac0,xpr,
               lVar24,0);
    local_4860._0_8_ = &local_40f0;
    auStack_3da0._8_8_ = peStack_4a98;
    auStack_3da0._0_8_ = vStack_4aa0.m_value;
    local_3dc0._0_8_ = local_4ac0._0_8_;
    local_3dc0._8_8_ = local_4ac0._8_8_;
    sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
    vStack_3da8.m_value = vStack_4aa8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_4860,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_3dc0);
    peVar5 = local_4cc0;
    auStack_3da0._8_8_ = local_4ca8;
    sStack_3d88.m_other = (double)local_f20;
    pMStack_3d80 = (XprTypeNested)0x24;
    vStack_3d78.m_value = 0;
    local_3d68.m_value = (long)local_a10;
    vStack_3d70.m_value = 0x36;
    local_3d50 = (element_type *)0x0;
    local_3d48 = (element_type *)0x3;
    local_3d40 = (element_type *)0x36;
    sStack_3d30.m_other = (double)local_4cb0;
    local_3d18.m_value = 0x24;
    local_3d00.m_other = (double)(local_8f0 + 0x90);
    local_3d10.m_value = 1;
    local_3d08.m_value = 0x36;
    local_3ce8 = 0.0;
    local_3ce0.m_other = 1.97626258336499e-323;
    local_3cd8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x36;
    local_3cc0.m_value = (long)pMVar6;
    local_3ca8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x24;
    local_3c90 = local_8f0 + 0x240;
    local_3ca0.m_other = 9.88131291682493e-324;
    local_3c98 = (XprTypeNested)0x36;
    local_3c78 = 0.0;
    local_3c70 = (XprTypeNested)0x5;
    local_3c68.m_value = 0x36;
    *local_4890 = 0.0;
    local_4890[1] = 0.0;
    local_3c28 = (PointerType)0x36;
    local_3c08.m_value = 0x24;
    local_3c00 = 1.48219693752374e-323;
    local_3bf8 = 2.66795448754273e-322;
    local_3be0 = local_4cc0;
    local_3bc8 = 0.0;
    local_3bc0 = (XprTypeNested)0x1;
    local_3bb0.m_value = (long)(local_8f0 + 0x1b0);
    local_3bb8.m_value = 0x36;
    local_3b40 = local_8f0 + 0x360;
    local_3b98 = 1.77863632502849e-322;
    local_3b90 = 1.97626258336499e-323;
    local_3b88 = 2.66795448754273e-322;
    local_3b70 = (Matrix<double,__1,__1,_1,__1,__1> *)local_4cc8;
    local_3b58 = 0.0;
    local_3b50 = 9.88131291682493e-324;
    local_3b48 = 2.66795448754273e-322;
    local_4ac0._0_8_ = local_44f0;
    local_3b28 = 1.77863632502849e-322;
    local_3b20 = 2.47032822920623e-323;
    local_3b18 = 2.66795448754273e-322;
    local_3d58 = (XprTypeNested)local_f20;
    local_3d20 = (XprTypeNested)local_f20;
    local_3cf0 = (XprTypeNested)local_f20;
    local_3cb0 = (XprTypeNested)local_f20;
    local_3c80 = (XprTypeNested)local_f20;
    local_3c50 = (XprTypeNested)local_f20;
    local_3c40 = (XprTypeNested)local_f20;
    local_3c20 = local_8f0;
    local_3c10.m_value = (long)local_f20;
    local_3bd0 = (XprTypeNested)local_f20;
    local_3ba0 = (XprTypeNested)local_f20;
    local_3b60 = (XprTypeNested)local_f20;
    local_3b30 = (XprTypeNested)local_f20;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)local_4ac0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    _auStack_3da0 = ZEXT824((RhsNested)local_f20);
    sStack_3d88.m_other = 2.66795448754273e-322;
    pMStack_3d80 = local_4ca8;
    local_3d68.m_value = 0x24;
    sStack_3d60.m_other = 0.0;
    local_3d58 = (XprTypeNested)0x36;
    local_3d48 = peVar5;
    sStack_3d30.m_other = 0.0;
    peStack_3d28 = (element_type *)0x1;
    local_3d20 = (XprTypeNested)0x36;
    local_3d18.m_value = (long)local_4cb0;
    local_3d00.m_other = 1.77863632502849e-322;
    local_3cf8 = (RhsNested)0x1;
    local_3cf0 = (XprTypeNested)0x36;
    local_3cd8 = (Matrix<double,__1,__1,_1,__1,__1> *)local_4cc8;
    local_3cc0.m_value = 0;
    local_3cb8.m_value = 2;
    local_3cb0 = (XprTypeNested)0x36;
    local_3ca8 = local_4cb8;
    local_3c90 = (undefined1 *)0x24;
    local_3c88.m_other = 9.88131291682493e-324;
    local_3c80 = (XprTypeNested)0x36;
    sStack_3db0.m_other = (double)local_f20;
    vStack_3d70.m_value = (long)local_f20;
    sStack_3d38.m_other = (double)local_f20;
    local_3d08.m_value = (long)local_f20;
    local_3cc8 = (XprTypeNested)local_f20;
    local_3c98 = (XprTypeNested)local_f20;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_4180,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_3dc0,local_4cd0,(StorageBaseType *)local_44f0);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_4180,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)local_4ac0,xpr,
               lVar24,0);
    local_4860._0_8_ = &local_4180;
    auStack_3da0._8_8_ = peStack_4a98;
    auStack_3da0._0_8_ = vStack_4aa0.m_value;
    local_3dc0._0_8_ = local_4ac0._0_8_;
    local_3dc0._8_8_ = local_4ac0._8_8_;
    sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
    vStack_3da8.m_value = vStack_4aa8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_4860,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_3dc0);
    ppCVar4 = local_4cc8;
    auStack_3da0._8_8_ = local_4ca0;
    sStack_3d88.m_other = (double)local_f20;
    pMStack_3d80 = (XprTypeNested)0x12;
    vStack_3d78.m_value = 0;
    local_3d68.m_value = (long)local_a10;
    vStack_3d70.m_value = 0x36;
    local_3d50 = (element_type *)0x0;
    local_3d48 = (element_type *)0x3;
    local_3d40 = (element_type *)0x36;
    local_3d18.m_value = 0x12;
    local_3d00.m_other = (double)(local_8f0 + 0x90);
    local_3d10.m_value = 1;
    local_3d08.m_value = 0x36;
    local_3ce8 = 0.0;
    local_3ce0.m_other = 1.97626258336499e-323;
    local_3cd8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x36;
    local_3ca8 = (Matrix<double,__1,__1,_1,__1,__1> *)0x12;
    local_3c90 = local_8f0 + 0x240;
    local_3ca0.m_other = 9.88131291682493e-324;
    local_3c98 = (XprTypeNested)0x36;
    local_3c78 = 0.0;
    local_3c70 = (XprTypeNested)0x5;
    local_3c68.m_value = 0x36;
    *local_4890 = 0.0;
    local_4890[1] = 0.0;
    local_3c28 = (PointerType)0x36;
    local_3c08.m_value = 0x12;
    local_3c00 = 1.48219693752374e-323;
    local_3bb0.m_value = (long)(local_8f0 + 0x120);
    local_3bf8 = 2.66795448754273e-322;
    local_3be0 = local_4cc0;
    local_3bc8 = 0.0;
    local_3bc0 = (XprTypeNested)0x1;
    local_3bb8.m_value = 0x36;
    local_3b40 = local_8f0 + 0x2d0;
    local_3b98 = 8.89318162514244e-323;
    local_3b90 = 1.97626258336499e-323;
    local_3b88 = 2.66795448754273e-322;
    local_3b70 = (Matrix<double,__1,__1,_1,__1,__1> *)local_4cc8;
    local_3b58 = 0.0;
    local_3b50 = 9.88131291682493e-324;
    local_3b48 = 2.66795448754273e-322;
    local_4ac0._0_8_ = local_44f0;
    local_3b28 = 8.89318162514244e-323;
    local_3b20 = 2.47032822920623e-323;
    local_3b18 = 2.66795448754273e-322;
    local_3d58 = (XprTypeNested)local_f20;
    sStack_3d30.m_other = (double)local_ce0;
    local_3d20 = (XprTypeNested)local_f20;
    local_3cf0 = (XprTypeNested)local_f20;
    local_3cc0.m_value = (long)local_b30;
    local_3cb0 = (XprTypeNested)local_f20;
    local_3c80 = (XprTypeNested)local_f20;
    local_3c50 = (XprTypeNested)local_f20;
    local_3c40 = (XprTypeNested)local_f20;
    local_3c20 = local_a10 + 0x90;
    local_3c10.m_value = (long)local_f20;
    local_3bd0 = (XprTypeNested)local_f20;
    local_3ba0 = (XprTypeNested)local_f20;
    local_3b60 = (XprTypeNested)local_f20;
    local_3b30 = (XprTypeNested)local_f20;
    Eigen::NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,18,1,0,18,1>,Eigen::MatrixBase> *)local_4ac0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    _auStack_3da0 = ZEXT824((XprTypeNested)local_f20);
    sStack_3d88.m_other = 2.66795448754273e-322;
    pMStack_3d80 = local_4ca0;
    local_3d68.m_value = 0x12;
    sStack_3d60.m_other = 0.0;
    local_3d58 = (XprTypeNested)0x36;
    local_3d48 = local_4cc0;
    sStack_3d30.m_other = 0.0;
    peStack_3d28 = (element_type *)0x1;
    local_3d20 = (XprTypeNested)0x36;
    local_3d00.m_other = 8.89318162514244e-323;
    local_3cf8 = (RhsNested)0x1;
    local_3cf0 = (XprTypeNested)0x36;
    local_3cd8 = (Matrix<double,__1,__1,_1,__1,__1> *)ppCVar4;
    local_3cc0.m_value = 0;
    local_3cb8.m_value = 2;
    local_3cb0 = (XprTypeNested)0x36;
    local_3c90 = (undefined1 *)0x12;
    local_3c88.m_other = 9.88131291682493e-324;
    local_3c80 = (XprTypeNested)0x36;
    sStack_3db0.m_other = (double)local_f20;
    vStack_3d70.m_value = (long)local_f20;
    sStack_3d38.m_other = (double)local_f20;
    local_3d18.m_value = (long)local_ce0;
    local_3d08.m_value = (long)local_f20;
    local_3cc8 = (XprTypeNested)local_f20;
    local_3ca8 = local_b30;
    local_3c98 = (XprTypeNested)local_f20;
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const,Eigen::Block<Eigen::Matrix<double,54,6,0,54,6>,18,1,false>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_45c0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_54,_6,_0,_54,_6>,_18,_1,_false>_>_>_>
                *)local_3dc0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_3dc0,local_4cd0,(StorageBaseType *)local_44f0);
    Eigen::MatrixBase<Eigen::Matrix<double,18,1,0,18,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_45c0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                *)local_3dc0);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_18,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false> *)local_4ac0,xpr,
               lVar24,0);
    local_4860._0_8_ = local_45c0;
    auStack_3da0._8_8_ = peStack_4a98;
    auStack_3da0._0_8_ = vStack_4aa0.m_value;
    local_3dc0._8_8_ = local_4ac0._8_8_;
    local_3dc0._0_8_ = local_4ac0._0_8_;
    sStack_3db0.m_other = (double)LStack_4ab0.m_matrix;
    vStack_3da8.m_value = vStack_4aa8.m_value;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>>::operator*=
              ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,18,1,0,18,1>>> *)local_4860,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_18,_1,_false>_>_>
                *)local_3dc0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_3f10,(double *)&local_4be0,(StorageBaseType *)local_4460);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_3fd0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 1,(StorageBaseType *)local_42b0);
    local_3e50.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = local_3f10.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[2];
    local_3e50.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = local_3f10.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data
          .array[3];
    local_3e50.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [8] = (double)local_3fd0._16_8_;
    local_3e50.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [9] = (double)local_3fb8;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_4340,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 2,(StorageBaseType *)local_4060);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_3e50,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4340);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_43d0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 3,(StorageBaseType *)&local_40f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_43d0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_48f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 4,(StorageBaseType *)&local_4180);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_48f0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4c90,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 5,(StorageBaseType *)local_45c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_4c90);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_4220,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_3dc0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_3fd0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 6,(StorageBaseType *)local_4460);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_4340,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 7,(StorageBaseType *)local_42b0);
    local_3f10.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = (double)local_3fd0._16_8_;
    local_3f10.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = (double)local_3fb8;
    local_3f10.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [8] = (double)local_4340._16_8_;
    local_3f10.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [9] = (double)local_4340._24_8_;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_43d0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 8,(StorageBaseType *)local_4060);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_3f10,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_43d0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_48f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 9,(StorageBaseType *)&local_40f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_48f0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4c90,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 10,(StorageBaseType *)&local_4180);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_4c90);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4520,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xb,(StorageBaseType *)local_45c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_4520);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_3e50,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_3dc0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_4340,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xc,(StorageBaseType *)local_4460);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_43d0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xd,(StorageBaseType *)local_42b0);
    local_3fb8 = (RhsNested)local_4340._16_8_;
    local_3fb0 = (double)local_4340._24_8_;
    local_3f90 = local_43d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage
                 .m_data.array[2];
    local_3f88 = (element_type *)
                 local_43d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage
                 .m_data.array[3];
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_48f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xe,(StorageBaseType *)local_4060);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_3fd0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_48f0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4c90,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0xf,(StorageBaseType *)&local_40f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_4c90);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4520,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x10,(StorageBaseType *)&local_4180);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_4520);
    Eigen::operator*(&local_3f38,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x11,(StorageBaseType *)local_45c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_3f38);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_3f10,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_3dc0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_43d0,local_4878,(StorageBaseType *)local_4460);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_48f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x13,(StorageBaseType *)local_42b0);
    local_4340._24_8_ =
         local_43d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.
         array[2];
    local_4340._32_8_ =
         local_43d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.
         array[3];
    local_4340._64_8_ = sStack_48e0.m_other;
    local_4340._72_8_ = vStack_48d8.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4c90,local_4880,(StorageBaseType *)local_4060);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4340,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_4c90);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4520,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x15,(StorageBaseType *)&local_40f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_4520);
    Eigen::operator*(&local_3f38,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x16,(StorageBaseType *)&local_4180);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_3f38);
    Eigen::operator*(&local_3e78,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x17,(StorageBaseType *)local_45c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_3e78);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_3fd0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_3dc0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)local_48f0,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x18,(StorageBaseType *)local_4460);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4c90,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x19,(StorageBaseType *)local_42b0);
    local_43d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [3] = sStack_48e0.m_other;
    local_43d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [4] = (double)vStack_48d8.m_value;
    local_43d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [8] = (double)local_4c90.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>
                  .m_xpr;
    local_43d0.super_PlainObjectBase<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>.m_storage.m_data.array
    [9] = (double)local_4c90.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>
                  .m_startRow.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4520,local_4888,(StorageBaseType *)local_4060);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)&local_43d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_4520);
    Eigen::operator*(&local_3f38,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1b,(StorageBaseType *)&local_40f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_3f38);
    Eigen::operator*(&local_3e78,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1c,(StorageBaseType *)&local_4180);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_3e78);
    Eigen::operator*(&local_1488,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1d,(StorageBaseType *)local_45c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1488);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)local_4340,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_3dc0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4c90,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1e,(StorageBaseType *)local_4460);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>
                      *)&local_4520,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x1f,(StorageBaseType *)local_42b0);
    vStack_48d8.m_value =
         (long)local_4c90.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
               m_xpr;
    vStack_48d0.m_value =
         local_4c90.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
         m_startRow.m_value;
    local_48b0 = (double)local_4520.
                         super_BlockImpl<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_18,_false,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_18,_false,_true>
                         .m_xpr;
    local_48a8 = (RhsNested)
                 local_4520.
                 super_BlockImpl<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_18,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_18,_false,_true>
                 .m_startRow.m_value;
    Eigen::operator*(&local_3f38,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x20,(StorageBaseType *)local_4060);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_48f0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_3f38);
    Eigen::operator*(&local_3e78,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x21,(StorageBaseType *)&local_40f0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_46d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_3e78);
    Eigen::operator*(&local_1488,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x22,(StorageBaseType *)&local_4180);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4860,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_1488);
    Eigen::operator*(&local_f48,
                     local_4be0.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                     m_storage.m_data.array + 0x23,(StorageBaseType *)local_45c0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)local_3dc0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
                 *)local_4ac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>
                 *)&local_f48);
    Eigen::PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,18,1,0,18,1>const>const,Eigen::Matrix<double,18,1,0,18,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,18,1,0,18,1>> *)&local_43d0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Matrix<double,_18,_1,_0,_18,_1>_>_>_>
                *)local_3dc0);
    lVar23 = 0;
    while( true ) {
      if (lVar23 == 0x18) break;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,xpr_00,
                 lVar23,startCol);
      pMStack_14a0 = (XprTypeNested)sStack_46b0.m_other;
      peStack_1498 = peStack_46a8;
      pMStack_14c0 = (XprTypeNested)local_46d0._0_8_;
      pMStack_14b8 = (XprTypeNested)local_46d0._8_8_;
      local_14b0 = peStack_46c0;
      pMStack_14a8 = (XprTypeNested)vStack_46b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_48f0,xpr_00,
                 lVar23,lVar20);
      vStack_4840.m_value = vStack_48d0.m_value;
      sStack_4838.m_other = (double)peStack_48c8;
      local_4860._0_8_ = local_48f0._0_8_;
      local_4860._8_8_ = local_48f0._8_8_;
      sStack_4850.m_other = sStack_48e0.m_other;
      vStack_4848.m_value = vStack_48d8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                (&local_4c90,xpr_00,lVar23,lVar22);
      local_4a70.m_matrix = &local_43d0;
      local_4a28.m_matrix = (non_const_type)local_4340;
      local_4c40[2] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.m_xpr
      ;
      local_4c40[3] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_startRow.m_value;
      local_4c40[4] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_startCol.m_value;
      local_4c40[5] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_outerStride;
      *local_4c40 = local_4c90.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_0>
                    .m_data;
      local_4c40[1] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_0>.
           _8_8_;
      local_4c40[2] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.m_xpr
      ;
      local_4c40[3] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_startRow.m_value;
      LStack_4ab0.m_matrix = &local_4220;
      vStack_4a88.m_value = (long)pMStack_14a0;
      peStack_4a80 = peStack_1498;
      vStack_4aa8.m_value = (long)pMStack_14c0;
      vStack_4aa0.m_value = (long)pMStack_14b8;
      peStack_4a98 = local_14b0;
      sStack_4a90.m_other = (double)pMStack_14a8;
      vStack_4a48.m_value = vStack_4840.m_value;
      sStack_4a40.m_other = sStack_4838.m_other;
      sStack_4a68.m_other = (double)local_4860._0_8_;
      peStack_4a60 = (element_type *)local_4860._8_8_;
      pMStack_4a58 = (XprTypeNested)sStack_4850.m_other;
      vStack_4a50.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_18,_false>::Block
                (&local_4520,(Matrix<double,_24,_54,_1,_24,_54> *)local_3dc0,lVar23,0);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,24,54,1,24,54>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,18,1,0,18,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,18,1,0,18,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,18,1,0,18,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const>const>>
                (&local_4520,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>_>_>
                  *)local_4ac0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,xpr_00,
                 lVar23,startCol);
      pMStack_14e0 = (XprTypeNested)sStack_46b0.m_other;
      peStack_14d8 = peStack_46a8;
      pMStack_1500 = (XprTypeNested)local_46d0._0_8_;
      pMStack_14f8 = (XprTypeNested)local_46d0._8_8_;
      local_14f0 = peStack_46c0;
      pMStack_14e8 = (XprTypeNested)vStack_46b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_48f0,xpr_00,
                 lVar23,lVar20);
      vStack_4840.m_value = vStack_48d0.m_value;
      sStack_4838.m_other = (double)peStack_48c8;
      local_4860._0_8_ = local_48f0._0_8_;
      local_4860._8_8_ = local_48f0._8_8_;
      sStack_4850.m_other = sStack_48e0.m_other;
      vStack_4848.m_value = vStack_48d8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                (&local_4c90,xpr_00,lVar23,lVar22);
      local_4a70.m_matrix = &local_3e50;
      local_4c40[2] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.m_xpr
      ;
      local_4c40[3] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_startRow.m_value;
      local_4c40[4] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_startCol.m_value;
      local_4c40[5] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_outerStride;
      *local_4c40 = local_4c90.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_0>
                    .m_data;
      local_4c40[1] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_0>.
           _8_8_;
      local_4c40[2] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.m_xpr
      ;
      local_4c40[3] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_startRow.m_value;
      LStack_4ab0.m_matrix = &local_43d0;
      vStack_4a88.m_value = (long)pMStack_14e0;
      peStack_4a80 = peStack_14d8;
      vStack_4aa8.m_value = (long)pMStack_1500;
      vStack_4aa0.m_value = (long)pMStack_14f8;
      peStack_4a98 = local_14f0;
      sStack_4a90.m_other = (double)pMStack_14e8;
      local_4a28.m_matrix = (non_const_type)local_3fd0;
      vStack_4a48.m_value = vStack_4840.m_value;
      sStack_4a40.m_other = sStack_4838.m_other;
      sStack_4a68.m_other = (double)local_4860._0_8_;
      peStack_4a60 = (element_type *)local_4860._8_8_;
      pMStack_4a58 = (XprTypeNested)sStack_4850.m_other;
      vStack_4a50.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_18,_false>::Block
                (&local_4520,(Matrix<double,_24,_54,_1,_24,_54> *)local_3dc0,lVar23,0x12);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,24,54,1,24,54>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,18,1,0,18,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,18,1,0,18,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,18,1,0,18,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const>const>>
                (&local_4520,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>_>_>
                  *)local_4ac0);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_46d0,xpr_00,
                 lVar23,startCol);
      pMStack_1520 = (XprTypeNested)sStack_46b0.m_other;
      peStack_1518 = peStack_46a8;
      pMStack_1540 = (XprTypeNested)local_46d0._0_8_;
      pMStack_1538 = (XprTypeNested)local_46d0._8_8_;
      local_1530 = peStack_46c0;
      pMStack_1528 = (XprTypeNested)vStack_46b8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false> *)local_48f0,xpr_00,
                 lVar23,lVar20);
      vStack_4840.m_value = vStack_48d0.m_value;
      sStack_4838.m_other = (double)peStack_48c8;
      local_4860._0_8_ = local_48f0._0_8_;
      local_4860._8_8_ = local_48f0._8_8_;
      sStack_4850.m_other = sStack_48e0.m_other;
      vStack_4848.m_value = vStack_48d8.m_value;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_18,_false>::Block
                (&local_4c90,xpr_00,lVar23,lVar22);
      local_4a70.m_matrix = (non_const_type)local_3fd0;
      local_4c40[2] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.m_xpr
      ;
      local_4c40[3] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_startRow.m_value;
      local_4c40[4] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_startCol.m_value;
      local_4c40[5] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_outerStride;
      *local_4c40 = local_4c90.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_0>
                    .m_data;
      local_4c40[1] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>,_0>.
           _8_8_;
      local_4c40[2] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.m_xpr
      ;
      local_4c40[3] =
           local_4c90.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false,_true>.
           m_startRow.m_value;
      LStack_4ab0.m_matrix = (non_const_type)local_4340;
      vStack_4a88.m_value = (long)pMStack_1520;
      peStack_4a80 = peStack_1518;
      vStack_4aa8.m_value = (long)pMStack_1540;
      vStack_4aa0.m_value = (long)pMStack_1538;
      peStack_4a98 = local_1530;
      sStack_4a90.m_other = (double)pMStack_1528;
      local_4a28.m_matrix = &local_3f10;
      vStack_4a48.m_value = vStack_4840.m_value;
      sStack_4a40.m_other = sStack_4838.m_other;
      sStack_4a68.m_other = (double)local_4860._0_8_;
      peStack_4a60 = (element_type *)local_4860._8_8_;
      pMStack_4a58 = (XprTypeNested)sStack_4850.m_other;
      vStack_4a50.m_value = vStack_4848.m_value;
      Eigen::Block<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_18,_false>::Block
                (&local_4520,(Matrix<double,_24,_54,_1,_24,_54> *)local_3dc0,lVar23,0x24);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,24,54,1,24,54>,1,18,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,18,1,0,18,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,18,1,0,18,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,18,1,0,18,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,18,false>const>const>>
                (&local_4520,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_18,_1,_0,_18,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_18,_false>_>_>
                  *)local_4ac0);
      lVar23 = lVar23 + 1;
    }
    local_4868 = 2;
    for (lVar23 = 0; lVar23 != 0x18; lVar23 = lVar23 + 1) {
      lVar20 = lVar23 * 3 + 1;
      lVar22 = lVar23 * 3 + 2;
      lVar25 = 0;
      lVar24 = local_4868;
      while( true ) {
        if (lVar24 == 0x4a) break;
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_54,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_54,_false> *)local_46d0,
                   xpr_00,lVar23,startCol);
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_54,_1,_1,_54>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_54,_false>_>
                          *)local_4860,&local_4c08,(StorageBaseType *)local_46d0);
        Eigen::Block<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_54,_false>::Block
                  ((Block<Eigen::Matrix<double,_24,_54,_1,_24,_54>,_1,_54,_false> *)local_48f0,
                   (Matrix<double,_24,_54,_1,_24,_54> *)local_3dc0,lVar23 + lVar25,0);
        vStack_4a50.m_value = vStack_48d0.m_value;
        vStack_4a48.m_value = (long)peStack_48c8;
        local_4a70.m_matrix = (non_const_type)local_48f0._0_8_;
        sStack_4a68.m_other = (double)local_48f0._8_8_;
        peStack_4a60 = (element_type *)sStack_48e0.m_other;
        pMStack_4a58 = (XprTypeNested)vStack_48d8.m_value;
        LStack_4ab0.m_matrix = (non_const_type)sStack_4850.m_other;
        vStack_4a88.m_value = vStack_4828.m_value;
        peStack_4a80 = peStack_4820;
        vStack_4aa8.m_value = vStack_4848.m_value;
        vStack_4aa0.m_value = vStack_4840.m_value;
        peStack_4a98 = (element_type *)sStack_4838.m_other;
        sStack_4a90.m_other = (double)vStack_4830.m_value;
        SVar26 = Eigen::internal::dense_product_base::operator_cast_to_double
                           ((dense_product_base *)local_4ac0);
        pSVar21 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                *)H,lVar23 * 3,lVar24 + -2);
        *pSVar21 = SVar26 + *pSVar21;
        pSVar21 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                *)H,lVar20,lVar24 + -1);
        *pSVar21 = SVar26 + *pSVar21;
        pSVar21 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                *)H,lVar22,lVar24);
        this_00 = local_4c98;
        *pSVar21 = SVar26 + *pSVar21;
        if (lVar25 != 0) {
          pSVar21 = Eigen::
                    DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                    ::operator()(local_4c98,lVar24 + -2,lVar23 * 3);
          *pSVar21 = SVar26 + *pSVar21;
          pSVar21 = Eigen::
                    DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                    ::operator()(this_00,lVar24 + -1,lVar20);
          *pSVar21 = SVar26 + *pSVar21;
          pSVar21 = Eigen::
                    DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                    ::operator()(this_00,lVar24,lVar22);
          *pSVar21 = SVar26 + *pSVar21;
        }
        lVar24 = lVar24 + 3;
        lVar25 = lVar25 + 1;
        H = (ChMatrixRef *)local_4c98;
      }
      local_4868 = local_4868 + 3;
    }
    Eigen::internal::handmade_aligned_free(local_4c60.m_storage.m_data);
    Eigen::internal::handmade_aligned_free(local_4c00.m_storage.m_data);
    Eigen::internal::handmade_aligned_free(local_4cf0.m_storage.m_data);
    lVar23 = local_4c48 + 1;
  }
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalJacobianContIntDamping(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For a small number of layers this method can be more efficient than the
    // "Pre-Integration" style calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // Zero out the Jacobian matrix since the results from each layer will be added to this value
    H.setZero();

    // Sum the contribution to the Jacobian matrix layer by layer
    for (int kl = 0; kl < m_numLayers; kl++) {
        // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
        // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
        // up the generalized internal force calculation while only having a minimal impact on the performance of the
        // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
        // calculation of the potentially non-symmetric and non-sparse component.  The second pieces is the symmetric
        // and sparse component.

        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        //==============================================================================
        //==============================================================================
        // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
        // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
        // time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP'...
        //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP'...
        //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP'...
        //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP'...
        //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP'...
        //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP']
        // Note that each partial derivative block shown is placed to the left of the previous block.
        // The explanation of the calculation above is just too long to write it all on a single line.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> PE;
        PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            PE.block<1, NIP>(3 * i, 0 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 1 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 2 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 3 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 4 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0).transpose());
            PE.block<1, NIP>(3 * i, 5 * NIP) = m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(0 * NIP, 0).transpose()) +
                                               m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                                                   .cwiseProduct(FC.template block<NIP, 1>(1 * NIP, 0).transpose());

            PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1).transpose());
            PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 1).transpose());

            PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2).transpose());
            PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP).cwiseProduct(FC.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP).cwiseProduct(FC.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
        // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
        // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
        // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
        // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
        // indices of the components are in transposed order
        //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks]
        // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks]
        //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                                   (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

        for (auto i = 0; i < 3; i++) {
            FCscaled.template block<NIP, 1>(0, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
            FCscaled.template block<NIP, 1>(2 * NIP, i).array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();
        }

        // =============================================================================
        // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
        // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
        // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
        // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
        // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
        // same time.  This value should be store in row major memory layout to align with the access patterns for
        // calculating this matrix.
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> Scaled_Combined_PE;
        Scaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        for (auto i = 0; i < NSF; i++) {
            Scaled_Combined_PE.block<1, NIP>(3 * i, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 0).transpose());
            Scaled_Combined_PE.block<1, NIP>(3 * i, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 0).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 0).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 1).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 1, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 1).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 1).transpose());

            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 0) =
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 2 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 3 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 4 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(2 * NIP, 2).transpose());
            Scaled_Combined_PE.block<1, NIP>((3 * i) + 2, 5 * NIP) =
                m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(0, 2).transpose()) +
                m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)
                    .cwiseProduct(FCscaled.template block<NIP, 1>(NIP, 2).transpose());
        }

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer at rotate it in the midsurface according to
        // the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in this
        // element
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Multiply the scaled and combined partial derivative block matrix by the stiffness matrix for each individual
        // Gauss quadrature point
        // =============================================================================

        Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::RowMajor> DScaled_Combined_PE;
        DScaled_Combined_PE.resize(3 * NSF, 6 * NIP);

        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 0) =
            D(0, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(0, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(0, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(0, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(0, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(0, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, NIP) =
            D(1, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(1, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(1, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(1, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(1, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(1, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 2 * NIP) =
            D(2, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(2, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(2, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(2, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(2, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(2, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 3 * NIP) =
            D(3, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(3, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(3, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(3, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(3, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(3, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 4 * NIP) =
            D(4, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(4, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(4, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(4, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(4, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(4, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);
        DScaled_Combined_PE.template block<3 * NSF, NIP>(0, 5 * NIP) =
            D(5, 0) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 0) +
            D(5, 1) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, NIP) +
            D(5, 2) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 2 * NIP) +
            D(5, 3) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 3 * NIP) +
            D(5, 4) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 4 * NIP) +
            D(5, 5) * Scaled_Combined_PE.block<3 * NSF, NIP>(0, 5 * NIP);

        // =============================================================================
        // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
        // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
        // =============================================================================

        H.noalias() += PE * DScaled_Combined_PE.transpose();

        //==============================================================================
        //==============================================================================
        // Calculate the sparse and symmetric component of the Jacobian matrix
        //==============================================================================
        //==============================================================================

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
        // quadrature point
        // =============================================================================

        ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

        for (auto i = 0; i < NSF; i++) {
            S_scaled_SD.template block<1, NIP>(i, 0) =
                SPK2_1_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, NIP) =
                SPK2_6_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_2_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));

            S_scaled_SD.template block<1, NIP>(i, 2 * NIP) =
                SPK2_5_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 0) * NIP)) +
                SPK2_4_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 1) * NIP)) +
                SPK2_3_Block.transpose().cwiseProduct(m_SD.block<1, NIP>(i, (3 * kl + 2) * NIP));
        }

        // =============================================================================
        // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
        // matrix and then expand them out to full size by summing the contribution into the correct locations of the
        // full sized Jacobian matrix
        // =============================================================================
        unsigned int idx = 0;
        for (unsigned int i = 0; i < NSF; i++) {
            for (unsigned int j = i; j < NSF; j++) {
                double d = Kfactor * m_SD.block<1, 3 * NIP>(i, 3 * kl * NIP) *
                           S_scaled_SD.template block<1, 3 * NIP>(j, 0).transpose();

                H(3 * i, 3 * j) += d;
                H(3 * i + 1, 3 * j + 1) += d;
                H(3 * i + 2, 3 * j + 2) += d;
                if (i != j) {
                    H(3 * j, 3 * i) += d;
                    H(3 * j + 1, 3 * i + 1) += d;
                    H(3 * j + 2, 3 * i + 2) += d;
                }
                idx++;
            }
        }
    }
}